

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  int _elempack;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Mat *c;
  _func_int **pp_Var6;
  size_t sVar7;
  size_t sVar8;
  Allocator *pAVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined4 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined4 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  int iVar43;
  undefined1 (*pauVar44) [64];
  float *pfVar45;
  Option *pOVar46;
  undefined1 (*pauVar47) [64];
  Mat *pMVar48;
  void *pvVar49;
  Mat *pMVar50;
  undefined1 (*pauVar51) [64];
  float *pfVar52;
  undefined1 (*pauVar53) [32];
  int iVar54;
  Mat *a;
  ulong uVar55;
  int y;
  uint uVar56;
  uint uVar57;
  __m512 *pafVar58;
  long lVar59;
  undefined8 *puVar60;
  undefined1 (*pauVar61) [32];
  uint uVar62;
  long lVar63;
  void *pvVar64;
  __m512 *pafVar65;
  undefined1 (*pauVar66) [32];
  long lVar67;
  void *pvVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  __m512 afVar72;
  undefined8 uVar73;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  float in_register_0000125c;
  binary_op_pow op;
  __m512 _p1;
  __m512 _a0;
  binary_op_pow local_159;
  Option *local_158;
  Mat *local_150;
  undefined8 local_148;
  __m512 *local_140;
  undefined8 local_138;
  Mat *local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  uint local_10c;
  size_t local_108;
  __m512 local_100;
  __m512 local_c0;
  uint local_7c;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar48 = a + 1;
  c = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar39 = a->elempack;
  _elempack = a[1].elempack;
  pp_Var6 = this->_vptr_BinaryOp_x86_avx512;
  local_158 = opt;
  local_150 = pMVar48;
  if (_elempack != 0x10 && iVar39 != 0x10) {
switchD_003bd1b5_default:
    if (_elempack != 8 && iVar39 != 8) {
switchD_003bd322_default:
      if (_elempack != 4 && iVar39 != 4) {
switchD_003bd409_default:
        iVar39 = BinaryOp::forward((BinaryOp *)
                                   ((long)&this->_vptr_BinaryOp_x86_avx512 + (long)pp_Var6[-3]),
                                   bottom_blobs,top_blobs,opt);
        return iVar39;
      }
      switch(*(undefined4 *)(&this->field_0xd0 + (long)pp_Var6[-3])) {
      case 0:
        iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>(a,pMVar48,c,opt);
        return iVar39;
      case 1:
        pMVar50 = pMVar48;
        break;
      case 2:
        iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>(a,pMVar48,c,opt);
        return iVar39;
      case 3:
        pMVar50 = pMVar48;
        goto LAB_003bdca3;
      case 4:
        iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>(a,pMVar48,c,opt);
        return iVar39;
      case 5:
        iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>(a,pMVar48,c,opt);
        return iVar39;
      case 6:
        iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>(a,pMVar48,c,opt);
        return iVar39;
      case 7:
        pMVar50 = a;
        a = pMVar48;
        break;
      case 8:
        pMVar50 = a;
        a = pMVar48;
LAB_003bdca3:
        iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>(a,pMVar50,c,opt);
        return iVar39;
      default:
        goto switchD_003bd409_default;
      }
      iVar39 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(a,pMVar50,c,opt);
      return iVar39;
    }
    switch(*(undefined4 *)(&this->field_0xd0 + (long)pp_Var6[-3])) {
    case 0:
      if (3 < a->dims - 1U) {
LAB_003cade6:
        return 0;
      }
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      uVar62 = a->w;
      uVar40 = a->h;
      iVar43 = a->d;
      uVar56 = a->c;
      uVar42 = (ulong)uVar56;
      local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
      sVar7 = a->elemsize;
      uVar57 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar41 = (ulong)uVar3;
      iVar54 = uVar5 * uVar57 * iVar4;
      sVar8 = a[1].elemsize;
      local_128 = uVar41;
      switch(a->dims) {
      case 1:
        if (iVar39 == 1 && uVar62 == 1) {
LAB_003bd3b4:
          local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
          local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
          iVar39 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                             (a,pMVar48,c,(Option *)opt->blob_allocator);
          return iVar39;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pfVar45 = (float *)c->data;
          if (pfVar45 == (float *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar61 = (undefined1 (*) [32])a->data;
          pfVar52 = (float *)a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar69 = *pauVar61;
              uVar40 = uVar57;
              do {
                fVar2 = pfVar52[1];
                fVar18 = pfVar52[2];
                fVar19 = pfVar52[3];
                fVar20 = pfVar52[4];
                fVar21 = pfVar52[5];
                fVar22 = pfVar52[6];
                fVar23 = pfVar52[7];
                *pfVar45 = auVar69._0_4_ + *pfVar52;
                pfVar45[1] = auVar69._4_4_ + fVar2;
                pfVar45[2] = auVar69._8_4_ + fVar18;
                pfVar45[3] = auVar69._12_4_ + fVar19;
                pfVar45[4] = auVar69._16_4_ + fVar20;
                pfVar45[5] = auVar69._20_4_ + fVar21;
                pfVar45[6] = auVar69._24_4_ + fVar22;
                pfVar45[7] = auVar69._28_4_ + fVar23;
                pfVar52 = pfVar52 + 8;
                pfVar45 = pfVar45 + 8;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar61 = pauVar61 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                fVar23 = pfVar45[7];
                pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42);
                *pfVar52 = auVar69._0_4_ + *pfVar45;
                pfVar52[1] = auVar69._4_4_ + fVar2;
                pfVar52[2] = auVar69._8_4_ + fVar18;
                pfVar52[3] = auVar69._12_4_ + fVar19;
                pfVar52[4] = auVar69._16_4_ + fVar20;
                pfVar52[5] = auVar69._20_4_ + fVar21;
                pfVar52[6] = auVar69._24_4_ + fVar22;
                pfVar52[7] = auVar69._28_4_ + fVar23;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                fVar23 = pfVar45[7];
                pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42);
                *pfVar52 = auVar69._0_4_ + *pfVar45;
                pfVar52[1] = auVar69._4_4_ + fVar2;
                pfVar52[2] = auVar69._8_4_ + fVar18;
                pfVar52[3] = auVar69._12_4_ + fVar19;
                pfVar52[4] = auVar69._16_4_ + fVar20;
                pfVar52[5] = auVar69._20_4_ + fVar21;
                pfVar52[6] = auVar69._24_4_ + fVar22;
                pfVar52[7] = auVar69._28_4_ + fVar23;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7d58;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar5) {
              pfVar45 = (float *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pfVar52 = (float *)(a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar61 = (undefined1 (*) [32])((long)a->w * uVar42 * a->elemsize + (long)a->data);
              uVar62 = 0;
              do {
                if (0 < (int)uVar57) {
                  auVar69 = *pauVar61;
                  uVar40 = uVar57;
                  do {
                    fVar2 = pfVar52[1];
                    fVar18 = pfVar52[2];
                    fVar19 = pfVar52[3];
                    fVar20 = pfVar52[4];
                    fVar21 = pfVar52[5];
                    fVar22 = pfVar52[6];
                    fVar23 = pfVar52[7];
                    *pfVar45 = auVar69._0_4_ + *pfVar52;
                    pfVar45[1] = auVar69._4_4_ + fVar2;
                    pfVar45[2] = auVar69._8_4_ + fVar18;
                    pfVar45[3] = auVar69._12_4_ + fVar19;
                    pfVar45[4] = auVar69._16_4_ + fVar20;
                    pfVar45[5] = auVar69._20_4_ + fVar21;
                    pfVar45[6] = auVar69._24_4_ + fVar22;
                    pfVar45[7] = auVar69._28_4_ + fVar23;
                    pfVar52 = pfVar52 + 8;
                    pfVar45 = pfVar45 + 8;
                    uVar40 = uVar40 - 1;
                  } while (uVar40 != 0);
                }
                pauVar61 = pauVar61 + 1;
                uVar62 = uVar62 + 1;
              } while (uVar62 != uVar5);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pfVar45 = (float *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pfVar52 = (float *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                                 (long)local_130[1].data);
              pauVar61 = (undefined1 (*) [32])
                         ((long)local_130->w * uVar42 * local_130->elemsize + (long)local_130->data)
              ;
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar69 = *pauVar61;
                  uVar62 = 0;
                  do {
                    uVar40 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        fVar23 = pfVar52[7];
                        *pfVar45 = auVar69._0_4_ + *pfVar52;
                        pfVar45[1] = auVar69._4_4_ + fVar2;
                        pfVar45[2] = auVar69._8_4_ + fVar18;
                        pfVar45[3] = auVar69._12_4_ + fVar19;
                        pfVar45[4] = auVar69._16_4_ + fVar20;
                        pfVar45[5] = auVar69._20_4_ + fVar21;
                        pfVar45[6] = auVar69._24_4_ + fVar22;
                        pfVar45[7] = auVar69._28_4_ + fVar23;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                pauVar61 = pauVar61 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = local_130[1].dims;
        if (iVar39 != 1) goto LAB_003c277e;
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pfVar45 = (float *)c->data;
        if (pfVar45 == (float *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pfVar52 = (float *)local_130->data;
          pauVar61 = (undefined1 (*) [32])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar69 = *pauVar61;
              uVar57 = uVar62;
              do {
                fVar2 = pfVar52[1];
                fVar18 = pfVar52[2];
                fVar19 = pfVar52[3];
                fVar20 = pfVar52[4];
                fVar21 = pfVar52[5];
                fVar22 = pfVar52[6];
                fVar23 = pfVar52[7];
                *pfVar45 = auVar69._0_4_ + *pfVar52;
                pfVar45[1] = auVar69._4_4_ + fVar2;
                pfVar45[2] = auVar69._8_4_ + fVar18;
                pfVar45[3] = auVar69._12_4_ + fVar19;
                pfVar45[4] = auVar69._16_4_ + fVar20;
                pfVar45[5] = auVar69._20_4_ + fVar21;
                pfVar45[6] = auVar69._24_4_ + fVar22;
                pfVar45[7] = auVar69._28_4_ + fVar23;
                pfVar52 = pfVar52 + 8;
                pfVar45 = pfVar45 + 8;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar61 = pauVar61 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_118 = sVar7;
          if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)local_148) {
                sVar7 = c->cstep;
                sVar8 = c->elemsize;
                auVar69 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar41 * a[1].elemsize);
                pvVar49 = c->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar64 = a->data;
                lVar63 = 0;
                iVar39 = (int)local_148;
                do {
                  pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41);
                  fVar2 = pfVar45[1];
                  fVar18 = pfVar45[2];
                  fVar19 = pfVar45[3];
                  fVar20 = pfVar45[4];
                  fVar21 = pfVar45[5];
                  fVar22 = pfVar45[6];
                  fVar23 = pfVar45[7];
                  pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                  *pfVar52 = auVar69._0_4_ + *pfVar45;
                  pfVar52[1] = auVar69._4_4_ + fVar2;
                  pfVar52[2] = auVar69._8_4_ + fVar18;
                  pfVar52[3] = auVar69._12_4_ + fVar19;
                  pfVar52[4] = auVar69._16_4_ + fVar20;
                  pfVar52[5] = auVar69._20_4_ + fVar21;
                  pfVar52[6] = auVar69._24_4_ + fVar22;
                  pfVar52[7] = auVar69._28_4_ + fVar23;
                  lVar63 = lVar63 + 0x20;
                  iVar39 = iVar39 + -1;
                } while (iVar39 != 0);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          local_120 = sVar8;
          if (uVar57 == uVar62) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
              Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  sVar10 = a->cstep;
                  pvVar49 = c->data;
                  pvVar64 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar68 = a->data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    fVar2 = *(float *)((long)pvVar64 + lVar63);
                    pfVar45 = (float *)((long)pvVar68 + lVar63 * 8 + sVar10 * sVar11 * uVar41);
                    auVar74._0_4_ = fVar2 + *pfVar45;
                    auVar74._4_4_ = fVar2 + pfVar45[1];
                    auVar74._8_4_ = fVar2 + pfVar45[2];
                    auVar74._12_4_ = fVar2 + pfVar45[3];
                    auVar74._16_4_ = fVar2 + pfVar45[4];
                    auVar74._20_4_ = fVar2 + pfVar45[5];
                    auVar74._24_4_ = fVar2 + pfVar45[6];
                    auVar74._28_4_ = fVar2 + pfVar45[7];
                    *(undefined1 (*) [32])((long)pvVar49 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar74;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            local_148 = CONCAT44(local_148._4_4_,iVar54);
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c80c3:
              local_148 = CONCAT44(local_148._4_4_,iVar54);
              Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar42 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  auVar69 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar42 * a->elemsize);
                  pvVar49 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar64 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42);
                    fVar2 = pfVar45[1];
                    fVar18 = pfVar45[2];
                    fVar19 = pfVar45[3];
                    fVar20 = pfVar45[4];
                    fVar21 = pfVar45[5];
                    fVar22 = pfVar45[6];
                    fVar23 = pfVar45[7];
                    pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42);
                    *pfVar52 = auVar69._0_4_ + *pfVar45;
                    pfVar52[1] = auVar69._4_4_ + fVar2;
                    pfVar52[2] = auVar69._8_4_ + fVar18;
                    pfVar52[3] = auVar69._12_4_ + fVar19;
                    pfVar52[4] = auVar69._16_4_ + fVar20;
                    pfVar52[5] = auVar69._20_4_ + fVar21;
                    pfVar52[6] = auVar69._24_4_ + fVar22;
                    pfVar52[7] = auVar69._28_4_ + fVar23;
                    lVar63 = lVar63 + 0x20;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar41);
              return 0;
            }
            if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
              Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_128 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  pvVar49 = a->data;
                  pvVar64 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar68 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    fVar2 = *(float *)((long)pvVar49 + lVar63);
                    pfVar45 = (float *)((long)pvVar68 + lVar63 * 8 + sVar10 * sVar11 * uVar41);
                    auVar77._0_4_ = fVar2 + *pfVar45;
                    auVar77._4_4_ = fVar2 + pfVar45[1];
                    auVar77._8_4_ = fVar2 + pfVar45[2];
                    auVar77._12_4_ = fVar2 + pfVar45[3];
                    auVar77._16_4_ = fVar2 + pfVar45[4];
                    auVar77._20_4_ = fVar2 + pfVar45[5];
                    auVar77._24_4_ = fVar2 + pfVar45[6];
                    auVar77._28_4_ = fVar2 + pfVar45[7];
                    *(undefined1 (*) [32])((long)pvVar64 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar77;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != local_128);
              return 0;
            }
          }
          else {
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c80c3;
          }
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar40) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar49 = a[1].data;
                  pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pfVar52 = (float *)(a->cstep * uVar41 * a->elemsize + (long)a->data);
                  uVar55 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      auVar69 = *(undefined1 (*) [32])
                                 ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                      uVar56 = uVar62;
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        fVar23 = pfVar52[7];
                        *pfVar45 = auVar69._0_4_ + *pfVar52;
                        pfVar45[1] = auVar69._4_4_ + fVar2;
                        pfVar45[2] = auVar69._8_4_ + fVar18;
                        pfVar45[3] = auVar69._12_4_ + fVar19;
                        pfVar45[4] = auVar69._16_4_ + fVar20;
                        pfVar45[5] = auVar69._20_4_ + fVar21;
                        pfVar45[6] = auVar69._24_4_ + fVar22;
                        pfVar45[7] = auVar69._28_4_ + fVar23;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar56 = uVar56 - 1;
                      } while (uVar56 != 0);
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar55 != uVar40);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar40) {
                  sVar7 = local_130[1].elemsize;
                  pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pvVar68 = (void *)(local_130->cstep * uVar41 * local_130->elemsize +
                                    (long)local_130->data);
                  sVar8 = local_130[1].cstep;
                  pvVar49 = local_130[1].data;
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      lVar63 = 0;
                      do {
                        pfVar45 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                        pfVar52 = (float *)((long)pvVar68 + lVar63);
                        auVar75._0_4_ = *pfVar45 + *pfVar52;
                        auVar75._4_4_ = pfVar45[1] + pfVar52[1];
                        auVar75._8_4_ = pfVar45[2] + pfVar52[2];
                        auVar75._12_4_ = pfVar45[3] + pfVar52[3];
                        auVar75._16_4_ = pfVar45[4] + pfVar52[4];
                        auVar75._20_4_ = pfVar45[5] + pfVar52[5];
                        auVar75._24_4_ = pfVar45[6] + pfVar52[6];
                        auVar75._28_4_ = pfVar45[7] + pfVar52[7];
                        *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar75;
                        lVar63 = lVar63 + 0x20;
                      } while ((ulong)uVar62 << 5 != lVar63);
                      pvVar64 = (void *)((long)pvVar64 + lVar63);
                      pvVar68 = (void *)((long)pvVar68 + lVar63);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
            local_130 = a;
            Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar40) {
                  sVar7 = local_130->cstep;
                  sVar8 = local_130->elemsize;
                  pvVar49 = local_130->data;
                  pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pfVar52 = (float *)(local_130[1].cstep * uVar41 * local_130[1].elemsize +
                                     (long)local_130[1].data);
                  uVar55 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar69 = *(undefined1 (*) [32])
                                 ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                      uVar62 = uVar57;
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        fVar23 = pfVar52[7];
                        *pfVar45 = auVar69._0_4_ + *pfVar52;
                        pfVar45[1] = auVar69._4_4_ + fVar2;
                        pfVar45[2] = auVar69._8_4_ + fVar18;
                        pfVar45[3] = auVar69._12_4_ + fVar19;
                        pfVar45[4] = auVar69._16_4_ + fVar20;
                        pfVar45[5] = auVar69._20_4_ + fVar21;
                        pfVar45[6] = auVar69._24_4_ + fVar22;
                        pfVar45[7] = auVar69._28_4_ + fVar23;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar62 = uVar62 - 1;
                      } while (uVar62 != 0);
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar55 != uVar40);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          pOVar46 = (Option *)opt->blob_allocator;
          local_130 = a;
          if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
            Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar5) {
                  sVar7 = local_130->elemsize;
                  pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pvVar68 = (void *)(local_130[1].cstep * uVar41 * local_130[1].elemsize +
                                    (long)local_130[1].data);
                  sVar8 = local_130->cstep;
                  pvVar49 = local_130->data;
                  uVar40 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      lVar63 = 0;
                      do {
                        pfVar45 = (float *)((long)pvVar68 + lVar63);
                        pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                        auVar79._0_4_ = *pfVar45 + *pfVar52;
                        auVar79._4_4_ = pfVar45[1] + pfVar52[1];
                        auVar79._8_4_ = pfVar45[2] + pfVar52[2];
                        auVar79._12_4_ = pfVar45[3] + pfVar52[3];
                        auVar79._16_4_ = pfVar45[4] + pfVar52[4];
                        auVar79._20_4_ = pfVar45[5] + pfVar52[5];
                        auVar79._24_4_ = pfVar45[6] + pfVar52[6];
                        auVar79._28_4_ = pfVar45[7] + pfVar52[7];
                        *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar79;
                        lVar63 = lVar63 + 0x20;
                      } while ((ulong)uVar62 << 5 != lVar63);
                      pvVar64 = (void *)((long)pvVar64 + lVar63);
                      pvVar68 = (void *)((long)pvVar68 + lVar63);
                    }
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar5);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          goto LAB_003bf390;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pfVar45 = (float *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pfVar52 = (float *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                                 (long)local_130[1].data);
              pauVar61 = (undefined1 (*) [32])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar69 = *pauVar61;
                      uVar40 = uVar57;
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        fVar23 = pfVar52[7];
                        *pfVar45 = auVar69._0_4_ + *pfVar52;
                        pfVar45[1] = auVar69._4_4_ + fVar2;
                        pfVar45[2] = auVar69._8_4_ + fVar18;
                        pfVar45[3] = auVar69._12_4_ + fVar19;
                        pfVar45[4] = auVar69._16_4_ + fVar20;
                        pfVar45[5] = auVar69._20_4_ + fVar21;
                        pfVar45[6] = auVar69._24_4_ + fVar22;
                        pfVar45[7] = auVar69._28_4_ + fVar23;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar61 = pauVar61 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)uVar40) {
              pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar61 = (undefined1 (*) [32])
                         ((long)local_130[1].w * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pfVar52 = (float *)(local_130->cstep * uVar41 * local_130->elemsize +
                                 (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar69 = *pauVar61;
                  uVar57 = uVar62;
                  do {
                    fVar2 = pfVar52[1];
                    fVar18 = pfVar52[2];
                    fVar19 = pfVar52[3];
                    fVar20 = pfVar52[4];
                    fVar21 = pfVar52[5];
                    fVar22 = pfVar52[6];
                    fVar23 = pfVar52[7];
                    *pfVar45 = auVar69._0_4_ + *pfVar52;
                    pfVar45[1] = auVar69._4_4_ + fVar2;
                    pfVar45[2] = auVar69._8_4_ + fVar18;
                    pfVar45[3] = auVar69._12_4_ + fVar19;
                    pfVar45[4] = auVar69._16_4_ + fVar20;
                    pfVar45[5] = auVar69._20_4_ + fVar21;
                    pfVar45[6] = auVar69._24_4_ + fVar22;
                    pfVar45[7] = auVar69._28_4_ + fVar23;
                    pfVar52 = pfVar52 + 8;
                    pfVar45 = pfVar45 + 8;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar61 = pauVar61 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                fVar23 = pfVar45[7];
                pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                *pfVar52 = auVar69._0_4_ + *pfVar45;
                pfVar52[1] = auVar69._4_4_ + fVar2;
                pfVar52[2] = auVar69._8_4_ + fVar18;
                pfVar52[3] = auVar69._12_4_ + fVar19;
                pfVar52[4] = auVar69._16_4_ + fVar20;
                pfVar52[5] = auVar69._20_4_ + fVar21;
                pfVar52[6] = auVar69._24_4_ + fVar22;
                pfVar52[7] = auVar69._28_4_ + fVar23;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        break;
      case 4:
        pOVar46 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003bf388;
        Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = a[1].dims;
        if (iVar39 != 1) {
          if (iVar39 == 3) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar61 = (undefined1 (*) [32])
                           (a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
                pfVar52 = (float *)(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    uVar56 = 0;
                    do {
                      if (0 < (int)uVar62) {
                        auVar69 = *pauVar61;
                        uVar57 = uVar62;
                        do {
                          fVar2 = pfVar52[1];
                          fVar18 = pfVar52[2];
                          fVar19 = pfVar52[3];
                          fVar20 = pfVar52[4];
                          fVar21 = pfVar52[5];
                          fVar22 = pfVar52[6];
                          fVar23 = pfVar52[7];
                          *pfVar45 = auVar69._0_4_ + *pfVar52;
                          pfVar45[1] = auVar69._4_4_ + fVar2;
                          pfVar45[2] = auVar69._8_4_ + fVar18;
                          pfVar45[3] = auVar69._12_4_ + fVar19;
                          pfVar45[4] = auVar69._16_4_ + fVar20;
                          pfVar45[5] = auVar69._20_4_ + fVar21;
                          pfVar45[6] = auVar69._24_4_ + fVar22;
                          pfVar45[7] = auVar69._28_4_ + fVar23;
                          pfVar52 = pfVar52 + 8;
                          pfVar45 = pfVar45 + 8;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      pauVar61 = pauVar61 + 1;
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if (iVar39 != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar43) {
              pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar61 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar41 * a[1].elemsize + (long)a[1].data);
              pfVar52 = (float *)(a->cstep * uVar41 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  auVar69 = *pauVar61;
                  uVar56 = 0;
                  do {
                    uVar57 = uVar62;
                    if (0 < (int)uVar62) {
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        fVar23 = pfVar52[7];
                        *pfVar45 = auVar69._0_4_ + *pfVar52;
                        pfVar45[1] = auVar69._4_4_ + fVar2;
                        pfVar45[2] = auVar69._8_4_ + fVar18;
                        pfVar45[3] = auVar69._12_4_ + fVar19;
                        pfVar45[4] = auVar69._16_4_ + fVar20;
                        pfVar45[5] = auVar69._20_4_ + fVar21;
                        pfVar45[6] = auVar69._24_4_ + fVar22;
                        pfVar45[7] = auVar69._28_4_ + fVar23;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                pauVar61 = pauVar61 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        if ((int)local_140 != 1 || a[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = a->data;
              sVar10 = c->cstep;
              sVar11 = c->elemsize;
              pvVar64 = c->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                pfVar45 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                fVar23 = pfVar45[7];
                pfVar52 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41);
                *pfVar52 = auVar69._0_4_ + *pfVar45;
                pfVar52[1] = auVar69._4_4_ + fVar2;
                pfVar52[2] = auVar69._8_4_ + fVar18;
                pfVar52[3] = auVar69._12_4_ + fVar19;
                pfVar52[4] = auVar69._16_4_ + fVar20;
                pfVar52[5] = auVar69._20_4_ + fVar21;
                pfVar52[6] = auVar69._24_4_ + fVar22;
                pfVar52[7] = auVar69._28_4_ + fVar23;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      goto LAB_003c7d4f;
    case 1:
      pMVar50 = pMVar48;
      break;
    case 2:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      uVar62 = a->w;
      uVar40 = a->h;
      iVar43 = a->d;
      uVar56 = a->c;
      uVar42 = (ulong)uVar56;
      local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
      sVar7 = a->elemsize;
      uVar57 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar41 = (ulong)uVar3;
      iVar54 = uVar5 * uVar57 * iVar4;
      sVar8 = a[1].elemsize;
      local_128 = uVar41;
      switch(a->dims) {
      case 1:
        if (iVar39 == 1 && uVar62 == 1) {
LAB_003bda61:
          local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
          local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
          iVar39 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                             (a,pMVar48,c,(Option *)opt->blob_allocator);
          return iVar39;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pfVar45 = (float *)c->data;
          if (pfVar45 == (float *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar61 = (undefined1 (*) [32])a->data;
          pfVar52 = (float *)a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar69 = *pauVar61;
              uVar40 = uVar57;
              do {
                fVar2 = pfVar52[1];
                fVar18 = pfVar52[2];
                fVar19 = pfVar52[3];
                fVar20 = pfVar52[4];
                fVar21 = pfVar52[5];
                fVar22 = pfVar52[6];
                *pfVar45 = auVar69._0_4_ * *pfVar52;
                pfVar45[1] = auVar69._4_4_ * fVar2;
                pfVar45[2] = auVar69._8_4_ * fVar18;
                pfVar45[3] = auVar69._12_4_ * fVar19;
                pfVar45[4] = auVar69._16_4_ * fVar20;
                pfVar45[5] = auVar69._20_4_ * fVar21;
                pfVar45[6] = auVar69._24_4_ * fVar22;
                pfVar45[7] = in_register_0000125c;
                pfVar52 = pfVar52 + 8;
                pfVar45 = pfVar45 + 8;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar61 = pauVar61 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42);
                *pfVar52 = auVar69._0_4_ * *pfVar45;
                pfVar52[1] = auVar69._4_4_ * fVar2;
                pfVar52[2] = auVar69._8_4_ * fVar18;
                pfVar52[3] = auVar69._12_4_ * fVar19;
                pfVar52[4] = auVar69._16_4_ * fVar20;
                pfVar52[5] = auVar69._20_4_ * fVar21;
                pfVar52[6] = auVar69._24_4_ * fVar22;
                pfVar52[7] = in_register_0000125c;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42);
                *pfVar52 = auVar69._0_4_ * *pfVar45;
                pfVar52[1] = auVar69._4_4_ * fVar2;
                pfVar52[2] = auVar69._8_4_ * fVar18;
                pfVar52[3] = auVar69._12_4_ * fVar19;
                pfVar52[4] = auVar69._16_4_ * fVar20;
                pfVar52[5] = auVar69._20_4_ * fVar21;
                pfVar52[6] = auVar69._24_4_ * fVar22;
                pfVar52[7] = in_register_0000125c;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7c4a;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar5) {
              pfVar45 = (float *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pfVar52 = (float *)(a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar61 = (undefined1 (*) [32])((long)a->w * uVar42 * a->elemsize + (long)a->data);
              uVar62 = 0;
              do {
                if (0 < (int)uVar57) {
                  auVar69 = *pauVar61;
                  uVar40 = uVar57;
                  do {
                    fVar2 = pfVar52[1];
                    fVar18 = pfVar52[2];
                    fVar19 = pfVar52[3];
                    fVar20 = pfVar52[4];
                    fVar21 = pfVar52[5];
                    fVar22 = pfVar52[6];
                    *pfVar45 = auVar69._0_4_ * *pfVar52;
                    pfVar45[1] = auVar69._4_4_ * fVar2;
                    pfVar45[2] = auVar69._8_4_ * fVar18;
                    pfVar45[3] = auVar69._12_4_ * fVar19;
                    pfVar45[4] = auVar69._16_4_ * fVar20;
                    pfVar45[5] = auVar69._20_4_ * fVar21;
                    pfVar45[6] = auVar69._24_4_ * fVar22;
                    pfVar45[7] = in_register_0000125c;
                    pfVar52 = pfVar52 + 8;
                    pfVar45 = pfVar45 + 8;
                    uVar40 = uVar40 - 1;
                  } while (uVar40 != 0);
                }
                pauVar61 = pauVar61 + 1;
                uVar62 = uVar62 + 1;
              } while (uVar62 != uVar5);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pfVar45 = (float *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pfVar52 = (float *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                                 (long)local_130[1].data);
              pauVar61 = (undefined1 (*) [32])
                         ((long)local_130->w * uVar42 * local_130->elemsize + (long)local_130->data)
              ;
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar69 = *pauVar61;
                  uVar62 = 0;
                  do {
                    uVar40 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        *pfVar45 = auVar69._0_4_ * *pfVar52;
                        pfVar45[1] = auVar69._4_4_ * fVar2;
                        pfVar45[2] = auVar69._8_4_ * fVar18;
                        pfVar45[3] = auVar69._12_4_ * fVar19;
                        pfVar45[4] = auVar69._16_4_ * fVar20;
                        pfVar45[5] = auVar69._20_4_ * fVar21;
                        pfVar45[6] = auVar69._24_4_ * fVar22;
                        pfVar45[7] = in_register_0000125c;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                pauVar61 = pauVar61 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = local_130[1].dims;
        if (iVar39 != 1) goto LAB_003c2609;
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pfVar45 = (float *)c->data;
        if (pfVar45 == (float *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pfVar52 = (float *)local_130->data;
          pauVar61 = (undefined1 (*) [32])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar69 = *pauVar61;
              uVar57 = uVar62;
              do {
                fVar2 = pfVar52[1];
                fVar18 = pfVar52[2];
                fVar19 = pfVar52[3];
                fVar20 = pfVar52[4];
                fVar21 = pfVar52[5];
                fVar22 = pfVar52[6];
                *pfVar45 = auVar69._0_4_ * *pfVar52;
                pfVar45[1] = auVar69._4_4_ * fVar2;
                pfVar45[2] = auVar69._8_4_ * fVar18;
                pfVar45[3] = auVar69._12_4_ * fVar19;
                pfVar45[4] = auVar69._16_4_ * fVar20;
                pfVar45[5] = auVar69._20_4_ * fVar21;
                pfVar45[6] = auVar69._24_4_ * fVar22;
                pfVar45[7] = in_register_0000125c;
                pfVar52 = pfVar52 + 8;
                pfVar45 = pfVar45 + 8;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar61 = pauVar61 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_118 = sVar7;
          if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)local_148) {
                sVar7 = c->cstep;
                sVar8 = c->elemsize;
                auVar69 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar41 * a[1].elemsize);
                pvVar49 = c->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar64 = a->data;
                lVar63 = 0;
                iVar39 = (int)local_148;
                do {
                  pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41);
                  fVar2 = pfVar45[1];
                  fVar18 = pfVar45[2];
                  fVar19 = pfVar45[3];
                  fVar20 = pfVar45[4];
                  fVar21 = pfVar45[5];
                  fVar22 = pfVar45[6];
                  pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                  *pfVar52 = auVar69._0_4_ * *pfVar45;
                  pfVar52[1] = auVar69._4_4_ * fVar2;
                  pfVar52[2] = auVar69._8_4_ * fVar18;
                  pfVar52[3] = auVar69._12_4_ * fVar19;
                  pfVar52[4] = auVar69._16_4_ * fVar20;
                  pfVar52[5] = auVar69._20_4_ * fVar21;
                  pfVar52[6] = auVar69._24_4_ * fVar22;
                  pfVar52[7] = in_register_0000125c;
                  lVar63 = lVar63 + 0x20;
                  iVar39 = iVar39 + -1;
                } while (iVar39 != 0);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          local_120 = sVar8;
          if (uVar57 == uVar62) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
              Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  sVar10 = a->cstep;
                  pvVar49 = c->data;
                  pvVar64 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar68 = a->data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    fVar2 = *(float *)((long)pvVar64 + lVar63);
                    pfVar45 = (float *)((long)pvVar68 + lVar63 * 8 + sVar10 * sVar11 * uVar41);
                    auVar14._4_4_ = fVar2 * pfVar45[1];
                    auVar14._0_4_ = fVar2 * *pfVar45;
                    auVar14._8_4_ = fVar2 * pfVar45[2];
                    auVar14._12_4_ = fVar2 * pfVar45[3];
                    auVar14._16_4_ = fVar2 * pfVar45[4];
                    auVar14._20_4_ = fVar2 * pfVar45[5];
                    auVar14._24_4_ = fVar2 * pfVar45[6];
                    auVar14._28_4_ = fVar2;
                    *(undefined1 (*) [32])((long)pvVar49 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar14;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            local_148 = CONCAT44(local_148._4_4_,iVar54);
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c7fbe:
              local_148 = CONCAT44(local_148._4_4_,iVar54);
              Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar42 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  auVar69 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar42 * a->elemsize);
                  pvVar49 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar64 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42);
                    fVar2 = pfVar45[1];
                    fVar18 = pfVar45[2];
                    fVar19 = pfVar45[3];
                    fVar20 = pfVar45[4];
                    fVar21 = pfVar45[5];
                    fVar22 = pfVar45[6];
                    pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42);
                    *pfVar52 = auVar69._0_4_ * *pfVar45;
                    pfVar52[1] = auVar69._4_4_ * fVar2;
                    pfVar52[2] = auVar69._8_4_ * fVar18;
                    pfVar52[3] = auVar69._12_4_ * fVar19;
                    pfVar52[4] = auVar69._16_4_ * fVar20;
                    pfVar52[5] = auVar69._20_4_ * fVar21;
                    pfVar52[6] = auVar69._24_4_ * fVar22;
                    pfVar52[7] = in_register_0000125c;
                    lVar63 = lVar63 + 0x20;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar41);
              return 0;
            }
            if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
              Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_128 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  pvVar49 = a->data;
                  pvVar64 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar68 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    fVar2 = *(float *)((long)pvVar49 + lVar63);
                    pfVar45 = (float *)((long)pvVar68 + lVar63 * 8 + sVar10 * sVar11 * uVar41);
                    auVar16._4_4_ = fVar2 * pfVar45[1];
                    auVar16._0_4_ = fVar2 * *pfVar45;
                    auVar16._8_4_ = fVar2 * pfVar45[2];
                    auVar16._12_4_ = fVar2 * pfVar45[3];
                    auVar16._16_4_ = fVar2 * pfVar45[4];
                    auVar16._20_4_ = fVar2 * pfVar45[5];
                    auVar16._24_4_ = fVar2 * pfVar45[6];
                    auVar16._28_4_ = fVar2;
                    *(undefined1 (*) [32])((long)pvVar64 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar16;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != local_128);
              return 0;
            }
          }
          else {
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c7fbe;
          }
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar40) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar49 = a[1].data;
                  pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pfVar52 = (float *)(a->cstep * uVar41 * a->elemsize + (long)a->data);
                  uVar55 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      auVar69 = *(undefined1 (*) [32])
                                 ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                      uVar56 = uVar62;
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        *pfVar45 = auVar69._0_4_ * *pfVar52;
                        pfVar45[1] = auVar69._4_4_ * fVar2;
                        pfVar45[2] = auVar69._8_4_ * fVar18;
                        pfVar45[3] = auVar69._12_4_ * fVar19;
                        pfVar45[4] = auVar69._16_4_ * fVar20;
                        pfVar45[5] = auVar69._20_4_ * fVar21;
                        pfVar45[6] = auVar69._24_4_ * fVar22;
                        pfVar45[7] = in_register_0000125c;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar56 = uVar56 - 1;
                      } while (uVar56 != 0);
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar55 != uVar40);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar40) {
                  sVar7 = local_130[1].elemsize;
                  pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pvVar68 = (void *)(local_130->cstep * uVar41 * local_130->elemsize +
                                    (long)local_130->data);
                  sVar8 = local_130[1].cstep;
                  pvVar49 = local_130[1].data;
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      lVar63 = 0;
                      do {
                        pfVar45 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                        pfVar52 = (float *)((long)pvVar68 + lVar63);
                        auVar15._4_4_ = pfVar45[1] * pfVar52[1];
                        auVar15._0_4_ = *pfVar45 * *pfVar52;
                        auVar15._8_4_ = pfVar45[2] * pfVar52[2];
                        auVar15._12_4_ = pfVar45[3] * pfVar52[3];
                        auVar15._16_4_ = pfVar45[4] * pfVar52[4];
                        auVar15._20_4_ = pfVar45[5] * pfVar52[5];
                        auVar15._24_4_ = pfVar45[6] * pfVar52[6];
                        auVar15._28_4_ = pfVar45[7];
                        *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar15;
                        lVar63 = lVar63 + 0x20;
                      } while ((ulong)uVar62 << 5 != lVar63);
                      pvVar64 = (void *)((long)pvVar64 + lVar63);
                      pvVar68 = (void *)((long)pvVar68 + lVar63);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
            local_130 = a;
            Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar40) {
                  sVar7 = local_130->cstep;
                  sVar8 = local_130->elemsize;
                  pvVar49 = local_130->data;
                  pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pfVar52 = (float *)(local_130[1].cstep * uVar41 * local_130[1].elemsize +
                                     (long)local_130[1].data);
                  uVar55 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar69 = *(undefined1 (*) [32])
                                 ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                      uVar62 = uVar57;
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        *pfVar45 = auVar69._0_4_ * *pfVar52;
                        pfVar45[1] = auVar69._4_4_ * fVar2;
                        pfVar45[2] = auVar69._8_4_ * fVar18;
                        pfVar45[3] = auVar69._12_4_ * fVar19;
                        pfVar45[4] = auVar69._16_4_ * fVar20;
                        pfVar45[5] = auVar69._20_4_ * fVar21;
                        pfVar45[6] = auVar69._24_4_ * fVar22;
                        pfVar45[7] = in_register_0000125c;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar62 = uVar62 - 1;
                      } while (uVar62 != 0);
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar55 != uVar40);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          pOVar46 = (Option *)opt->blob_allocator;
          local_130 = a;
          if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
            Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep != 0) {
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)uVar5) {
                  sVar7 = local_130->elemsize;
                  pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                  pvVar68 = (void *)(local_130[1].cstep * uVar41 * local_130[1].elemsize +
                                    (long)local_130[1].data);
                  sVar8 = local_130->cstep;
                  pvVar49 = local_130->data;
                  uVar40 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      lVar63 = 0;
                      do {
                        pfVar45 = (float *)((long)pvVar68 + lVar63);
                        pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                        auVar17._4_4_ = pfVar45[1] * pfVar52[1];
                        auVar17._0_4_ = *pfVar45 * *pfVar52;
                        auVar17._8_4_ = pfVar45[2] * pfVar52[2];
                        auVar17._12_4_ = pfVar45[3] * pfVar52[3];
                        auVar17._16_4_ = pfVar45[4] * pfVar52[4];
                        auVar17._20_4_ = pfVar45[5] * pfVar52[5];
                        auVar17._24_4_ = pfVar45[6] * pfVar52[6];
                        auVar17._28_4_ = pfVar45[7];
                        *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar17;
                        lVar63 = lVar63 + 0x20;
                      } while ((ulong)uVar62 << 5 != lVar63);
                      pvVar64 = (void *)((long)pvVar64 + lVar63);
                      pvVar68 = (void *)((long)pvVar68 + lVar63);
                    }
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar5);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            return -100;
          }
          goto LAB_003bf139;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pfVar45 = (float *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pfVar52 = (float *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                                 (long)local_130[1].data);
              pauVar61 = (undefined1 (*) [32])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar69 = *pauVar61;
                      uVar40 = uVar57;
                      do {
                        fVar2 = pfVar52[1];
                        fVar18 = pfVar52[2];
                        fVar19 = pfVar52[3];
                        fVar20 = pfVar52[4];
                        fVar21 = pfVar52[5];
                        fVar22 = pfVar52[6];
                        *pfVar45 = auVar69._0_4_ * *pfVar52;
                        pfVar45[1] = auVar69._4_4_ * fVar2;
                        pfVar45[2] = auVar69._8_4_ * fVar18;
                        pfVar45[3] = auVar69._12_4_ * fVar19;
                        pfVar45[4] = auVar69._16_4_ * fVar20;
                        pfVar45[5] = auVar69._20_4_ * fVar21;
                        pfVar45[6] = auVar69._24_4_ * fVar22;
                        pfVar45[7] = in_register_0000125c;
                        pfVar52 = pfVar52 + 8;
                        pfVar45 = pfVar45 + 8;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar61 = pauVar61 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)uVar40) {
              pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar61 = (undefined1 (*) [32])
                         ((long)local_130[1].w * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pfVar52 = (float *)(local_130->cstep * uVar41 * local_130->elemsize +
                                 (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar69 = *pauVar61;
                  uVar57 = uVar62;
                  do {
                    fVar2 = pfVar52[1];
                    fVar18 = pfVar52[2];
                    fVar19 = pfVar52[3];
                    fVar20 = pfVar52[4];
                    fVar21 = pfVar52[5];
                    fVar22 = pfVar52[6];
                    *pfVar45 = auVar69._0_4_ * *pfVar52;
                    pfVar45[1] = auVar69._4_4_ * fVar2;
                    pfVar45[2] = auVar69._8_4_ * fVar18;
                    pfVar45[3] = auVar69._12_4_ * fVar19;
                    pfVar45[4] = auVar69._16_4_ * fVar20;
                    pfVar45[5] = auVar69._20_4_ * fVar21;
                    pfVar45[6] = auVar69._24_4_ * fVar22;
                    pfVar45[7] = in_register_0000125c;
                    pfVar52 = pfVar52 + 8;
                    pfVar45 = pfVar45 + 8;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar61 = pauVar61 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                pfVar45 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                pfVar52 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                *pfVar52 = auVar69._0_4_ * *pfVar45;
                pfVar52[1] = auVar69._4_4_ * fVar2;
                pfVar52[2] = auVar69._8_4_ * fVar18;
                pfVar52[3] = auVar69._12_4_ * fVar19;
                pfVar52[4] = auVar69._16_4_ * fVar20;
                pfVar52[5] = auVar69._20_4_ * fVar21;
                pfVar52[6] = auVar69._24_4_ * fVar22;
                pfVar52[7] = in_register_0000125c;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        break;
      case 4:
        pOVar46 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003bf131;
        Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = a[1].dims;
        if (iVar39 != 1) {
          if (iVar39 == 3) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar61 = (undefined1 (*) [32])
                           (a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
                pfVar52 = (float *)(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    uVar56 = 0;
                    do {
                      if (0 < (int)uVar62) {
                        auVar69 = *pauVar61;
                        uVar57 = uVar62;
                        do {
                          fVar2 = pfVar52[1];
                          fVar18 = pfVar52[2];
                          fVar19 = pfVar52[3];
                          fVar20 = pfVar52[4];
                          fVar21 = pfVar52[5];
                          fVar22 = pfVar52[6];
                          *pfVar45 = auVar69._0_4_ * *pfVar52;
                          pfVar45[1] = auVar69._4_4_ * fVar2;
                          pfVar45[2] = auVar69._8_4_ * fVar18;
                          pfVar45[3] = auVar69._12_4_ * fVar19;
                          pfVar45[4] = auVar69._16_4_ * fVar20;
                          pfVar45[5] = auVar69._20_4_ * fVar21;
                          pfVar45[6] = auVar69._24_4_ * fVar22;
                          pfVar45[7] = in_register_0000125c;
                          pfVar52 = pfVar52 + 8;
                          pfVar45 = pfVar45 + 8;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      pauVar61 = pauVar61 + 1;
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if (iVar39 == 2) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pfVar45 = (float *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar61 = (undefined1 (*) [32])
                           ((long)a[1].w * uVar41 * a[1].elemsize + (long)a[1].data);
                pfVar52 = (float *)(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    auVar69 = *pauVar61;
                    uVar56 = 0;
                    do {
                      uVar57 = uVar62;
                      if (0 < (int)uVar62) {
                        do {
                          fVar2 = pfVar52[1];
                          fVar18 = pfVar52[2];
                          fVar19 = pfVar52[3];
                          fVar20 = pfVar52[4];
                          fVar21 = pfVar52[5];
                          fVar22 = pfVar52[6];
                          *pfVar45 = auVar69._0_4_ * *pfVar52;
                          pfVar45[1] = auVar69._4_4_ * fVar2;
                          pfVar45[2] = auVar69._8_4_ * fVar18;
                          pfVar45[3] = auVar69._12_4_ * fVar19;
                          pfVar45[4] = auVar69._16_4_ * fVar20;
                          pfVar45[5] = auVar69._20_4_ * fVar21;
                          pfVar45[6] = auVar69._24_4_ * fVar22;
                          pfVar45[7] = in_register_0000125c;
                          pfVar52 = pfVar52 + 8;
                          pfVar45 = pfVar45 + 8;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  pauVar61 = pauVar61 + 1;
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          return 0;
        }
        if ((int)local_140 != 1 || a[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = a->data;
              sVar10 = c->cstep;
              sVar11 = c->elemsize;
              pvVar64 = c->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                pfVar45 = (float *)((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41);
                fVar2 = pfVar45[1];
                fVar18 = pfVar45[2];
                fVar19 = pfVar45[3];
                fVar20 = pfVar45[4];
                fVar21 = pfVar45[5];
                fVar22 = pfVar45[6];
                pfVar52 = (float *)((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41);
                *pfVar52 = auVar69._0_4_ * *pfVar45;
                pfVar52[1] = auVar69._4_4_ * fVar2;
                pfVar52[2] = auVar69._8_4_ * fVar18;
                pfVar52[3] = auVar69._12_4_ * fVar19;
                pfVar52[4] = auVar69._16_4_ * fVar20;
                pfVar52[5] = auVar69._20_4_ * fVar21;
                pfVar52[6] = auVar69._24_4_ * fVar22;
                pfVar52[7] = in_register_0000125c;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      goto LAB_003c7c41;
    case 3:
      pMVar50 = pMVar48;
      goto LAB_003bdc0f;
    case 4:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      uVar62 = a->w;
      uVar40 = a->h;
      iVar43 = a->d;
      uVar56 = a->c;
      uVar42 = (ulong)uVar56;
      local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
      sVar7 = a->elemsize;
      uVar57 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar41 = (ulong)uVar3;
      iVar54 = uVar5 * uVar57 * iVar4;
      sVar8 = a[1].elemsize;
      local_128 = uVar41;
      switch(a->dims) {
      case 1:
        if (iVar39 == 1 && uVar62 == 1) {
LAB_003bd9b3:
          local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
          local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
          iVar39 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                             (a,pMVar48,c,(Option *)opt->blob_allocator);
          return iVar39;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar61 = (undefined1 (*) [32])c->data;
          if (pauVar61 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar66 = (undefined1 (*) [32])a->data;
          pauVar53 = (undefined1 (*) [32])a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar69 = *pauVar66;
              uVar40 = uVar57;
              do {
                auVar12 = vmaxps_avx(auVar69,*pauVar53);
                *pauVar61 = auVar12;
                pauVar53 = pauVar53 + 1;
                pauVar61 = pauVar61 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar66 = pauVar66 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar12 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42));
                *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar12 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42));
                *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7aad;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar5) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar53 = (undefined1 (*) [32])((long)a->w * uVar42 * a->elemsize + (long)a->data);
              uVar62 = 0;
              do {
                if (0 < (int)uVar57) {
                  auVar69 = *pauVar53;
                  uVar40 = uVar57;
                  do {
                    auVar12 = vmaxps_avx(auVar69,*pauVar66);
                    *pauVar61 = auVar12;
                    pauVar66 = pauVar66 + 1;
                    pauVar61 = pauVar61 + 1;
                    uVar40 = uVar40 - 1;
                  } while (uVar40 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar62 = uVar62 + 1;
              } while (uVar62 != uVar5);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar53 = (undefined1 (*) [32])
                         ((long)local_130->w * uVar42 * local_130->elemsize + (long)local_130->data)
              ;
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar69 = *pauVar53;
                  uVar62 = 0;
                  do {
                    uVar40 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        auVar12 = vmaxps_avx(auVar69,*pauVar66);
                        *pauVar61 = auVar12;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                pauVar53 = pauVar53 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = local_130[1].dims;
        if (iVar39 != 1) goto LAB_003c2180;
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pauVar61 = (undefined1 (*) [32])c->data;
        if (pauVar61 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pauVar66 = (undefined1 (*) [32])local_130->data;
          pauVar53 = (undefined1 (*) [32])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar69 = *pauVar53;
              uVar57 = uVar62;
              do {
                auVar12 = vmaxps_avx(auVar69,*pauVar66);
                *pauVar61 = auVar12;
                pauVar66 = pauVar66 + 1;
                pauVar61 = pauVar61 + 1;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar53 = pauVar53 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_118 = sVar7;
          if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)local_148) {
                sVar7 = c->cstep;
                sVar8 = c->elemsize;
                auVar69 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar41 * a[1].elemsize);
                pvVar49 = c->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar64 = a->data;
                lVar63 = 0;
                iVar39 = (int)local_148;
                do {
                  auVar12 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41))
                  ;
                  *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar12;
                  lVar63 = lVar63 + 0x20;
                  iVar39 = iVar39 + -1;
                } while (iVar39 != 0);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          local_120 = sVar8;
          if (uVar57 == uVar62) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
              Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  sVar10 = a->cstep;
                  pvVar49 = c->data;
                  pvVar64 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar68 = a->data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar64 + lVar63);
                    auVar13._4_4_ = uVar1;
                    auVar13._0_4_ = uVar1;
                    auVar13._8_4_ = uVar1;
                    auVar13._12_4_ = uVar1;
                    auVar13._16_4_ = uVar1;
                    auVar13._20_4_ = uVar1;
                    auVar13._24_4_ = uVar1;
                    auVar13._28_4_ = uVar1;
                    auVar69 = vmaxps_avx512vl(*(undefined1 (*) [32])
                                               ((long)pvVar68 +
                                               lVar63 * 8 + sVar10 * sVar11 * uVar41),auVar13);
                    *(undefined1 (*) [32])((long)pvVar49 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar69;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            local_148 = CONCAT44(local_148._4_4_,iVar54);
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c7eb9:
              local_148 = CONCAT44(local_148._4_4_,iVar54);
              Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar42 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  auVar69 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar42 * a->elemsize);
                  pvVar49 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar64 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    auVar12 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42
                                                  ));
                    *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) =
                         auVar12;
                    lVar63 = lVar63 + 0x20;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar41);
              return 0;
            }
            if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
              Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_128 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  pvVar49 = a->data;
                  pvVar64 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar68 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar49 + lVar63);
                    auVar76._4_4_ = uVar1;
                    auVar76._0_4_ = uVar1;
                    auVar76._8_4_ = uVar1;
                    auVar76._12_4_ = uVar1;
                    auVar76._16_4_ = uVar1;
                    auVar76._20_4_ = uVar1;
                    auVar76._24_4_ = uVar1;
                    auVar76._28_4_ = uVar1;
                    auVar69 = vmaxps_avx(auVar76,*(undefined1 (*) [32])
                                                  ((long)pvVar68 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar41));
                    *(undefined1 (*) [32])((long)pvVar64 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar69;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != local_128);
              return 0;
            }
          }
          else {
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c7eb9;
          }
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar49 = a[1].data;
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])(a->cstep * uVar41 * a->elemsize + (long)a->data);
                uVar55 = 0;
                do {
                  if (0 < (int)uVar62) {
                    auVar69 = *(undefined1 (*) [32])
                               ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                    uVar56 = uVar62;
                    do {
                      auVar12 = vmaxps_avx(auVar69,*pauVar66);
                      *pauVar61 = auVar12;
                      pauVar66 = pauVar66 + 1;
                      pauVar61 = pauVar61 + 1;
                      uVar56 = uVar56 - 1;
                    } while (uVar56 != 0);
                  }
                  uVar55 = uVar55 + 1;
                } while (uVar55 != uVar40);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                sVar7 = local_130[1].elemsize;
                pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pvVar68 = (void *)(local_130->cstep * uVar41 * local_130->elemsize +
                                  (long)local_130->data);
                sVar8 = local_130[1].cstep;
                pvVar49 = local_130[1].data;
                uVar56 = 0;
                do {
                  if (0 < (int)uVar62) {
                    lVar63 = 0;
                    do {
                      auVar69 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar68 + lVar63),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41));
                      *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar69;
                      lVar63 = lVar63 + 0x20;
                    } while ((ulong)uVar62 << 5 != lVar63);
                    pvVar64 = (void *)((long)pvVar64 + lVar63);
                    pvVar68 = (void *)((long)pvVar68 + lVar63);
                  }
                  uVar56 = uVar56 + 1;
                } while (uVar56 != uVar40);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
            local_130 = a;
            Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                sVar7 = local_130->cstep;
                sVar8 = local_130->elemsize;
                pvVar49 = local_130->data;
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])
                           (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                           (long)local_130[1].data);
                uVar55 = 0;
                do {
                  if (0 < (int)uVar57) {
                    auVar69 = *(undefined1 (*) [32])
                               ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                    uVar62 = uVar57;
                    do {
                      auVar12 = vmaxps_avx(auVar69,*pauVar66);
                      *pauVar61 = auVar12;
                      pauVar66 = pauVar66 + 1;
                      pauVar61 = pauVar61 + 1;
                      uVar62 = uVar62 - 1;
                    } while (uVar62 != 0);
                  }
                  uVar55 = uVar55 + 1;
                } while (uVar55 != uVar40);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          pOVar46 = (Option *)opt->blob_allocator;
          local_130 = a;
          if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
            Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar5) {
                sVar7 = local_130->elemsize;
                pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pvVar68 = (void *)(local_130[1].cstep * uVar41 * local_130[1].elemsize +
                                  (long)local_130[1].data);
                sVar8 = local_130->cstep;
                pvVar49 = local_130->data;
                uVar40 = 0;
                do {
                  if (0 < (int)uVar62) {
                    lVar63 = 0;
                    do {
                      auVar69 = vmaxps_avx(*(undefined1 (*) [32])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41),
                                           *(undefined1 (*) [32])((long)pvVar68 + lVar63));
                      *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar69;
                      lVar63 = lVar63 + 0x20;
                    } while ((ulong)uVar62 << 5 != lVar63);
                    pvVar64 = (void *)((long)pvVar64 + lVar63);
                    pvVar68 = (void *)((long)pvVar68 + lVar63);
                  }
                  uVar40 = uVar40 + 1;
                } while (uVar40 != uVar5);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          goto LAB_003beee2;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar53 = (undefined1 (*) [32])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar69 = *pauVar53;
                      uVar40 = uVar57;
                      do {
                        auVar12 = vmaxps_avx(auVar69,*pauVar66);
                        *pauVar61 = auVar12;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)uVar40) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         ((long)local_130[1].w * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar53 = (undefined1 (*) [32])
                         (local_130->cstep * uVar41 * local_130->elemsize + (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar69 = *pauVar66;
                  uVar57 = uVar62;
                  do {
                    auVar12 = vmaxps_avx(auVar69,*pauVar53);
                    *pauVar61 = auVar12;
                    pauVar53 = pauVar53 + 1;
                    pauVar61 = pauVar61 + 1;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar66 = pauVar66 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar12 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41));
                *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        break;
      case 4:
        pOVar46 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003beeda;
        Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = a[1].dims;
        if (iVar39 != 1) {
          if (iVar39 == 3) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])
                           (a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
                pauVar53 = (undefined1 (*) [32])(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    uVar56 = 0;
                    do {
                      if (0 < (int)uVar62) {
                        auVar69 = *pauVar66;
                        uVar57 = uVar62;
                        do {
                          auVar12 = vmaxps_avx(auVar69,*pauVar53);
                          *pauVar61 = auVar12;
                          pauVar53 = pauVar53 + 1;
                          pauVar61 = pauVar61 + 1;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      pauVar66 = pauVar66 + 1;
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if (iVar39 == 2) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])
                           ((long)a[1].w * uVar41 * a[1].elemsize + (long)a[1].data);
                pauVar53 = (undefined1 (*) [32])(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    auVar69 = *pauVar66;
                    uVar56 = 0;
                    do {
                      uVar57 = uVar62;
                      if (0 < (int)uVar62) {
                        do {
                          auVar12 = vmaxps_avx(auVar69,*pauVar53);
                          *pauVar61 = auVar12;
                          pauVar53 = pauVar53 + 1;
                          pauVar61 = pauVar61 + 1;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  pauVar66 = pauVar66 + 1;
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          return 0;
        }
        if ((int)local_140 != 1 || a[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = a->data;
              sVar10 = c->cstep;
              sVar11 = c->elemsize;
              pvVar64 = c->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar12 = vmaxps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41));
                *(undefined1 (*) [32])((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      goto LAB_003c7aa4;
    case 5:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      uVar62 = a->w;
      uVar40 = a->h;
      iVar43 = a->d;
      uVar56 = a->c;
      uVar42 = (ulong)uVar56;
      local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
      sVar7 = a->elemsize;
      uVar57 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar41 = (ulong)uVar3;
      iVar54 = uVar5 * uVar57 * iVar4;
      sVar8 = a[1].elemsize;
      local_128 = uVar41;
      switch(a->dims) {
      case 1:
        if (iVar39 == 1 && uVar62 == 1) {
LAB_003bdb38:
          local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
          local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
          iVar39 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                             (a,pMVar48,c,(Option *)opt->blob_allocator);
          return iVar39;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar61 = (undefined1 (*) [32])c->data;
          if (pauVar61 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar66 = (undefined1 (*) [32])a->data;
          pauVar53 = (undefined1 (*) [32])a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar69 = *pauVar66;
              uVar40 = uVar57;
              do {
                auVar12 = vminps_avx(auVar69,*pauVar53);
                *pauVar61 = auVar12;
                pauVar53 = pauVar53 + 1;
                pauVar61 = pauVar61 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar66 = pauVar66 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar12 = vminps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42));
                *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)a->data + uVar42 * 0x20);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar12 = vminps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42));
                *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7e04;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar5) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar53 = (undefined1 (*) [32])((long)a->w * uVar42 * a->elemsize + (long)a->data);
              uVar62 = 0;
              do {
                if (0 < (int)uVar57) {
                  auVar69 = *pauVar53;
                  uVar40 = uVar57;
                  do {
                    auVar12 = vminps_avx(auVar69,*pauVar66);
                    *pauVar61 = auVar12;
                    pauVar66 = pauVar66 + 1;
                    pauVar61 = pauVar61 + 1;
                    uVar40 = uVar40 - 1;
                  } while (uVar40 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar62 = uVar62 + 1;
              } while (uVar62 != uVar5);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar53 = (undefined1 (*) [32])
                         ((long)local_130->w * uVar42 * local_130->elemsize + (long)local_130->data)
              ;
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar69 = *pauVar53;
                  uVar62 = 0;
                  do {
                    uVar40 = uVar57;
                    if (0 < (int)uVar57) {
                      do {
                        auVar12 = vminps_avx(auVar69,*pauVar66);
                        *pauVar61 = auVar12;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                pauVar53 = pauVar53 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = local_130[1].dims;
        a = local_130;
        if (iVar39 != 1) goto joined_r0x003c295f;
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pauVar61 = (undefined1 (*) [32])c->data;
        if (pauVar61 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pauVar66 = (undefined1 (*) [32])local_130->data;
          pauVar53 = (undefined1 (*) [32])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar69 = *pauVar53;
              uVar57 = uVar62;
              do {
                auVar12 = vminps_avx(auVar69,*pauVar66);
                *pauVar61 = auVar12;
                pauVar66 = pauVar66 + 1;
                pauVar61 = pauVar61 + 1;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar53 = pauVar53 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_118 = sVar7;
          if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)local_148) {
                sVar7 = c->cstep;
                sVar8 = c->elemsize;
                auVar69 = *(undefined1 (*) [32])
                           ((long)a[1].data + a[1].cstep * uVar41 * a[1].elemsize);
                pvVar49 = c->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar64 = a->data;
                lVar63 = 0;
                iVar39 = (int)local_148;
                do {
                  auVar12 = vminps_avx(auVar69,*(undefined1 (*) [32])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41))
                  ;
                  *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar12;
                  lVar63 = lVar63 + 0x20;
                  iVar39 = iVar39 + -1;
                } while (iVar39 != 0);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          local_120 = sVar8;
          if (uVar57 == uVar62) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
              Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar56 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  sVar10 = a->cstep;
                  pvVar49 = c->data;
                  pvVar64 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar68 = a->data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar64 + lVar63);
                    auVar12._4_4_ = uVar1;
                    auVar12._0_4_ = uVar1;
                    auVar12._8_4_ = uVar1;
                    auVar12._12_4_ = uVar1;
                    auVar12._16_4_ = uVar1;
                    auVar12._20_4_ = uVar1;
                    auVar12._24_4_ = uVar1;
                    auVar12._28_4_ = uVar1;
                    auVar69 = vminps_avx512vl(*(undefined1 (*) [32])
                                               ((long)pvVar68 +
                                               lVar63 * 8 + sVar10 * sVar11 * uVar41),auVar12);
                    *(undefined1 (*) [32])((long)pvVar49 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar69;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar42);
              return 0;
            }
            local_148 = CONCAT44(local_148._4_4_,iVar54);
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c81c8:
              local_148 = CONCAT44(local_148._4_4_,iVar54);
              Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar42 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  auVar69 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar42 * a->elemsize);
                  pvVar49 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar64 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    auVar12 = vminps_avx(auVar69,*(undefined1 (*) [32])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42
                                                  ));
                    *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) =
                         auVar12;
                    lVar63 = lVar63 + 0x20;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar41);
              return 0;
            }
            if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
              Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_128 < 1) {
                return 0;
              }
              uVar41 = 0;
              do {
                if (0 < (int)local_148) {
                  sVar7 = c->cstep;
                  sVar8 = c->elemsize;
                  pvVar49 = a->data;
                  pvVar64 = c->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar68 = a[1].data;
                  lVar63 = 0;
                  iVar39 = (int)local_148;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar49 + lVar63);
                    auVar78._4_4_ = uVar1;
                    auVar78._0_4_ = uVar1;
                    auVar78._8_4_ = uVar1;
                    auVar78._12_4_ = uVar1;
                    auVar78._16_4_ = uVar1;
                    auVar78._20_4_ = uVar1;
                    auVar78._24_4_ = uVar1;
                    auVar78._28_4_ = uVar1;
                    auVar69 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                                  ((long)pvVar68 +
                                                  lVar63 * 8 + sVar10 * sVar11 * uVar41));
                    *(undefined1 (*) [32])((long)pvVar64 + lVar63 * 8 + sVar7 * sVar8 * uVar41) =
                         auVar69;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                uVar41 = uVar41 + 1;
              } while (uVar41 != local_128);
              return 0;
            }
          }
          else {
            local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c81c8;
          }
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar49 = a[1].data;
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])(a->cstep * uVar41 * a->elemsize + (long)a->data);
                uVar55 = 0;
                do {
                  if (0 < (int)uVar62) {
                    auVar69 = *(undefined1 (*) [32])
                               ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                    uVar56 = uVar62;
                    do {
                      auVar12 = vminps_avx(auVar69,*pauVar66);
                      *pauVar61 = auVar12;
                      pauVar66 = pauVar66 + 1;
                      pauVar61 = pauVar61 + 1;
                      uVar56 = uVar56 - 1;
                    } while (uVar56 != 0);
                  }
                  uVar55 = uVar55 + 1;
                } while (uVar55 != uVar40);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                sVar7 = local_130[1].elemsize;
                pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pvVar68 = (void *)(local_130->cstep * uVar41 * local_130->elemsize +
                                  (long)local_130->data);
                sVar8 = local_130[1].cstep;
                pvVar49 = local_130[1].data;
                uVar56 = 0;
                do {
                  if (0 < (int)uVar62) {
                    lVar63 = 0;
                    do {
                      auVar69 = vminps_avx(*(undefined1 (*) [32])((long)pvVar68 + lVar63),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41));
                      *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar69;
                      lVar63 = lVar63 + 0x20;
                    } while ((ulong)uVar62 << 5 != lVar63);
                    pvVar64 = (void *)((long)pvVar64 + lVar63);
                    pvVar68 = (void *)((long)pvVar68 + lVar63);
                  }
                  uVar56 = uVar56 + 1;
                } while (uVar56 != uVar40);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
            local_130 = a;
            Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar40) {
                sVar7 = local_130->cstep;
                sVar8 = local_130->elemsize;
                pvVar49 = local_130->data;
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])
                           (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                           (long)local_130[1].data);
                uVar55 = 0;
                do {
                  if (0 < (int)uVar57) {
                    auVar69 = *(undefined1 (*) [32])
                               ((long)pvVar49 + uVar55 * 0x20 + sVar7 * uVar41 * sVar8);
                    uVar62 = uVar57;
                    do {
                      auVar12 = vminps_avx(auVar69,*pauVar66);
                      *pauVar61 = auVar12;
                      pauVar66 = pauVar66 + 1;
                      pauVar61 = pauVar61 + 1;
                      uVar62 = uVar62 - 1;
                    } while (uVar62 != 0);
                  }
                  uVar55 = uVar55 + 1;
                } while (uVar55 != uVar40);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          pOVar46 = (Option *)opt->blob_allocator;
          local_130 = a;
          if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
            Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < (int)uVar5) {
                sVar7 = local_130->elemsize;
                pvVar64 = (void *)(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pvVar68 = (void *)(local_130[1].cstep * uVar41 * local_130[1].elemsize +
                                  (long)local_130[1].data);
                sVar8 = local_130->cstep;
                pvVar49 = local_130->data;
                uVar40 = 0;
                do {
                  if (0 < (int)uVar62) {
                    lVar63 = 0;
                    do {
                      auVar69 = vminps_avx(*(undefined1 (*) [32])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41),
                                           *(undefined1 (*) [32])((long)pvVar68 + lVar63));
                      *(undefined1 (*) [32])((long)pvVar64 + lVar63) = auVar69;
                      lVar63 = lVar63 + 0x20;
                    } while ((ulong)uVar62 << 5 != lVar63);
                    pvVar64 = (void *)((long)pvVar64 + lVar63);
                    pvVar68 = (void *)((long)pvVar68 + lVar63);
                  }
                  uVar40 = uVar40 + 1;
                } while (uVar40 != uVar5);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          goto LAB_003bf772;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar4) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar53 = (undefined1 (*) [32])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar69 = *pauVar53;
                      uVar40 = uVar57;
                      do {
                        auVar12 = vminps_avx(auVar69,*pauVar66);
                        *pauVar61 = auVar12;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)uVar40) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         ((long)local_130[1].w * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar53 = (undefined1 (*) [32])
                         (local_130->cstep * uVar41 * local_130->elemsize + (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar69 = *pauVar66;
                  uVar57 = uVar62;
                  do {
                    auVar12 = vminps_avx(auVar69,*pauVar53);
                    *pauVar61 = auVar12;
                    pauVar53 = pauVar53 + 1;
                    pauVar61 = pauVar61 + 1;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar66 = pauVar66 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar12 = vminps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41));
                *(undefined1 (*) [32])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        break;
      case 4:
        pOVar46 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003bf76a;
        Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = a[1].dims;
        if (iVar39 != 1) {
          if (iVar39 == 3) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])
                           (a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
                pauVar53 = (undefined1 (*) [32])(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    uVar56 = 0;
                    do {
                      if (0 < (int)uVar62) {
                        auVar69 = *pauVar66;
                        uVar57 = uVar62;
                        do {
                          auVar12 = vminps_avx(auVar69,*pauVar53);
                          *pauVar61 = auVar12;
                          pauVar53 = pauVar53 + 1;
                          pauVar61 = pauVar61 + 1;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      pauVar66 = pauVar66 + 1;
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          if (iVar39 == 2) {
            if ((int)uVar56 < 1) {
              return 0;
            }
            uVar41 = 0;
            do {
              if (0 < iVar43) {
                pauVar61 = (undefined1 (*) [32])(c->cstep * uVar41 * c->elemsize + (long)c->data);
                pauVar66 = (undefined1 (*) [32])
                           ((long)a[1].w * uVar41 * a[1].elemsize + (long)a[1].data);
                pauVar53 = (undefined1 (*) [32])(a->cstep * uVar41 * a->elemsize + (long)a->data);
                iVar39 = 0;
                do {
                  if (0 < (int)uVar40) {
                    auVar69 = *pauVar66;
                    uVar56 = 0;
                    do {
                      uVar57 = uVar62;
                      if (0 < (int)uVar62) {
                        do {
                          auVar12 = vminps_avx(auVar69,*pauVar53);
                          *pauVar61 = auVar12;
                          pauVar53 = pauVar53 + 1;
                          pauVar61 = pauVar61 + 1;
                          uVar57 = uVar57 - 1;
                        } while (uVar57 != 0);
                      }
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar40);
                  }
                  pauVar66 = pauVar66 + 1;
                  iVar39 = iVar39 + 1;
                } while (iVar39 != iVar43);
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != uVar42);
            return 0;
          }
          return 0;
        }
        if ((int)local_140 != 1 || a[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar69 = *(undefined1 (*) [32])((long)local_150->data + uVar41 * 0x20);
              pvVar49 = a->data;
              sVar10 = c->cstep;
              sVar11 = c->elemsize;
              pvVar64 = c->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar12 = vminps_avx(auVar69,*(undefined1 (*) [32])
                                              ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41));
                *(undefined1 (*) [32])((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41) = auVar12;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      goto LAB_003c7dfb;
    case 6:
      if (3 < a->dims - 1U) {
        return 0;
      }
      uVar62 = a->w;
      local_140 = (__m512 *)(ulong)uVar62;
      uVar40 = a->h;
      local_150 = (Mat *)(ulong)uVar40;
      iVar43 = a->d;
      uVar56 = a->c;
      local_120 = (ulong)uVar56;
      local_128 = CONCAT44(local_128._4_4_,uVar40 * uVar62 * iVar43);
      local_108 = a->elemsize;
      local_138._0_4_ = a[1].w;
      uVar57 = a[1].h;
      iVar4 = a[1].d;
      uVar5 = a[1].c;
      local_118 = (ulong)uVar5;
      local_158 = (Option *)CONCAT44(local_158._4_4_,uVar57);
      local_148 = CONCAT44(local_148._4_4_,iVar4);
      local_10c = uVar57 * (uint)local_138 * iVar4;
      sVar7 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar39 != 1 || uVar62 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_003c17eb_caseD_1;
          case 2:
            local_130 = a;
            Mat::create(c,(uint)local_138,uVar57,sVar7,_elempack,opt->blob_allocator);
            puVar60 = (undefined8 *)c->data;
            if (puVar60 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)(uint)local_158 < 1) {
              return 0;
            }
            local_150 = (Mat *)local_130->data;
            pauVar61 = (undefined1 (*) [32])local_130[1].data;
            local_140 = (__m512 *)((ulong)local_140 & 0xffffffff00000000);
            do {
              afVar72 = local_c0;
              uVar24 = local_150->data;
              uVar25 = local_150->refcount;
              uVar26 = local_150->elemsize;
              uVar27 = local_150->elempack;
              uVar28 = *(undefined4 *)&local_150->field_0x1c;
              local_c0[7] = (float)uVar28;
              local_c0[6] = (float)uVar27;
              local_c0._16_8_ = uVar26;
              local_c0._8_8_ = uVar25;
              local_c0._0_8_ = uVar24;
              local_c0._32_32_ = afVar72._32_32_;
              uVar62 = (uint)local_138;
              if (0 < (int)(uint)local_138) {
                do {
                  uVar73 = *(undefined8 *)*pauVar61;
                  uVar80 = *(undefined8 *)((long)*pauVar61 + 8);
                  uVar81 = *(undefined8 *)((long)*pauVar61 + 0x10);
                  uVar82 = *(undefined8 *)((long)*pauVar61 + 0x18);
                  local_100._0_32_ = *pauVar61;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  pauVar61 = pauVar61 + 1;
                  puVar60 = puVar60 + 4;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              local_150 = (Mat *)((long)local_150 + 0x20);
              iVar39 = (int)local_140 + 1;
              local_140 = (__m512 *)CONCAT44(local_140._4_4_,iVar39);
            } while (iVar39 != (uint)local_158);
            return 0;
          case 3:
            local_130 = a;
            Mat::create(c,(uint)local_138,uVar57,uVar5,sVar7,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_118 < 1) {
              return 0;
            }
            local_150 = (Mat *)0x0;
            do {
              local_c0._0_32_ =
                   *(undefined1 (*) [32])((long)local_130->data + (long)local_150 * 0x20);
              if (0 < (int)local_10c) {
                local_158 = (Option *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
                local_138 = (__m512 *)
                            (local_130[1].cstep * local_130[1].elemsize * (long)local_150 +
                            (long)local_130[1].data);
                lVar63 = 0;
                uVar62 = local_10c;
                do {
                  pauVar61 = (undefined1 (*) [32])((long)local_138 + lVar63);
                  uVar73 = *(undefined8 *)*pauVar61;
                  uVar80 = *(undefined8 *)(*pauVar61 + 8);
                  uVar81 = *(undefined8 *)(*pauVar61 + 0x10);
                  uVar82 = *(undefined8 *)(*pauVar61 + 0x18);
                  local_100._0_32_ = *pauVar61;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                  puVar60 = (undefined8 *)((long)local_158 + lVar63);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  lVar63 = lVar63 + 0x20;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              local_150 = (Mat *)((long)local_150 + 1);
            } while (local_150 != (Mat *)local_118);
            return 0;
          case 4:
            local_130 = a;
            Mat::create(c,(uint)local_138,uVar57,iVar4,uVar5,sVar7,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_118 < 1) {
              return 0;
            }
            local_150 = (Mat *)0x0;
            do {
              local_c0._0_32_ =
                   *(undefined1 (*) [32])((long)local_130->data + (long)local_150 * 0x20);
              if (0 < (int)local_10c) {
                local_158 = (Option *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
                local_138 = (__m512 *)
                            (local_130[1].cstep * local_130[1].elemsize * (long)local_150 +
                            (long)local_130[1].data);
                lVar63 = 0;
                uVar62 = local_10c;
                do {
                  pauVar61 = (undefined1 (*) [32])((long)local_138 + lVar63);
                  uVar73 = *(undefined8 *)*pauVar61;
                  uVar80 = *(undefined8 *)(*pauVar61 + 8);
                  uVar81 = *(undefined8 *)(*pauVar61 + 0x10);
                  uVar82 = *(undefined8 *)(*pauVar61 + 0x18);
                  local_100._0_32_ = *pauVar61;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                  puVar60 = (undefined8 *)((long)local_158 + lVar63);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  lVar63 = lVar63 + 0x20;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              local_150 = (Mat *)((long)local_150 + 1);
            } while (local_150 != (Mat *)local_118);
            return 0;
          default:
            return 0;
          }
        }
LAB_003bdbf1:
        iVar39 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                           (a,pMVar48,c,(Option *)opt->blob_allocator);
        return iVar39;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_130 = a;
          Mat::create(c,(uint)local_138,uVar57,uVar5,sVar7,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_118 < 1) {
            return 0;
          }
          local_148 = 0;
          do {
            if (0 < (int)(uint)local_158) {
              pauVar66 = (undefined1 (*) [32])(c->cstep * local_148 * c->elemsize + (long)c->data);
              pauVar61 = (undefined1 (*) [32])
                         (local_130[1].cstep * local_148 * local_130[1].elemsize +
                         (long)local_130[1].data);
              local_150 = (Mat *)((long)local_130->w * local_148 * local_130->elemsize +
                                 (long)local_130->data);
              iVar39 = 0;
              do {
                local_140 = (__m512 *)CONCAT44(local_140._4_4_,iVar39);
                local_c0._0_32_ = *(undefined1 (*) [32])local_150;
                uVar62 = (uint)local_138;
                if (0 < (int)(uint)local_138) {
                  do {
                    auVar69 = *pauVar61;
                    local_100[0] = (float)auVar69._0_4_;
                    local_100[1] = (float)auVar69._4_4_;
                    local_100[2] = (float)auVar69._8_4_;
                    local_100[3] = (float)auVar69._12_4_;
                    local_100[4] = (float)auVar69._16_4_;
                    local_100[5] = (float)auVar69._20_4_;
                    local_100[6] = (float)auVar69._24_4_;
                    local_100[7] = (float)auVar69._28_4_;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                    *pauVar66 = auVar69;
                    pauVar61 = pauVar61 + 1;
                    pauVar66 = pauVar66 + 1;
                    uVar62 = uVar62 - 1;
                  } while (uVar62 != 0);
                }
                local_150 = (Mat *)((long)local_150 + 0x20);
                iVar39 = (int)local_140 + 1;
              } while (iVar39 != (uint)local_158);
            }
            local_148 = local_148 + 1;
          } while (local_148 != local_118);
          return 0;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,(uint)local_138,uVar57,iVar4,uVar5,sVar7,_elempack,pAVar9);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_118 < 1) {
            return 0;
          }
          local_120 = 0;
          do {
            if (0 < (int)local_148) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * local_120 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130[1].cstep * local_120 * local_130[1].elemsize +
                         (long)local_130[1].data);
              local_140 = (__m512 *)
                          ((long)local_130->w * local_120 * local_130->elemsize +
                          (long)local_130->data);
              iVar39 = 0;
              do {
                local_128 = CONCAT44(local_128._4_4_,iVar39);
                local_c0._0_32_ = *(undefined1 (*) [32])local_140;
                if (0 < (int)(uint)local_158) {
                  iVar39 = 0;
                  do {
                    local_150 = (Mat *)CONCAT44(local_150._4_4_,iVar39);
                    uVar62 = (uint)local_138;
                    if (0 < (int)(uint)local_138) {
                      do {
                        auVar69 = *pauVar66;
                        local_100[0] = (float)auVar69._0_4_;
                        local_100[1] = (float)auVar69._4_4_;
                        local_100[2] = (float)auVar69._8_4_;
                        local_100[3] = (float)auVar69._12_4_;
                        local_100[4] = (float)auVar69._16_4_;
                        local_100[5] = (float)auVar69._20_4_;
                        local_100[6] = (float)auVar69._24_4_;
                        local_100[7] = (float)auVar69._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                        *pauVar61 = auVar69;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar62 = uVar62 - 1;
                      } while (uVar62 != 0);
                    }
                    iVar39 = (int)local_150 + 1;
                  } while (iVar39 != (uint)local_158);
                }
                local_140 = (__m512 *)((long)local_140 + 0x20);
                iVar39 = (int)local_128 + 1;
              } while (iVar39 != (int)local_148);
            }
            local_120 = local_120 + 1;
          } while (local_120 != local_118);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,local_108,iVar39,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims == 1) {
          Mat::create(c,(int)local_140,(int)local_150,local_108,iVar39,opt->blob_allocator);
          puVar60 = (undefined8 *)c->data;
          if (puVar60 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if (_elempack != 1 || local_130[1].w != 1) {
            if ((int)local_150 < 1) {
              return 0;
            }
            pauVar61 = (undefined1 (*) [32])local_130->data;
            local_158 = (Option *)local_130[1].data;
            local_138 = (__m512 *)((ulong)local_138._4_4_ << 0x20);
            do {
              afVar72 = local_c0;
              uVar29 = local_158->lightmode;
              uVar30 = *(undefined3 *)&local_158->field_0x1;
              uVar31 = local_158->num_threads;
              uVar32 = local_158->blob_allocator;
              uVar33 = local_158->workspace_allocator;
              uVar34 = local_158->openmp_blocktime;
              uVar35 = local_158->use_winograd_convolution;
              uVar36 = local_158->use_sgemm_convolution;
              uVar37 = local_158->use_int8_inference;
              uVar38 = local_158->use_vulkan_compute;
              local_c0[7]._3_1_ = uVar38;
              local_c0[7]._2_1_ = uVar37;
              local_c0[7]._1_1_ = uVar36;
              local_c0[7]._0_1_ = uVar35;
              local_c0[6] = (float)uVar34;
              local_c0._16_8_ = uVar33;
              local_c0._8_8_ = uVar32;
              local_c0[1] = (float)uVar31;
              local_c0[0]._1_3_ = uVar30;
              local_c0[0]._0_1_ = uVar29;
              local_c0._32_32_ = afVar72._32_32_;
              uVar41 = (ulong)local_140 & 0xffffffff;
              if (0 < (int)local_140) {
                do {
                  uVar73 = *(undefined8 *)*pauVar61;
                  uVar80 = *(undefined8 *)((long)*pauVar61 + 8);
                  uVar81 = *(undefined8 *)((long)*pauVar61 + 0x10);
                  uVar82 = *(undefined8 *)((long)*pauVar61 + 0x18);
                  local_100._0_32_ = *pauVar61;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  pauVar61 = pauVar61 + 1;
                  puVar60 = puVar60 + 4;
                  uVar62 = (int)uVar41 - 1;
                  uVar41 = (ulong)uVar62;
                } while (uVar62 != 0);
              }
              local_158 = (Option *)((long)local_158 + 0x20);
              iVar39 = (uint)local_138 + 1;
              local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
            } while (iVar39 != (int)local_150);
            return 0;
          }
          pOVar46 = (Option *)opt->blob_allocator;
          goto LAB_003c7d84;
        }
        if (local_130[1].dims != 2) {
          return 0;
        }
        pOVar46 = (Option *)opt->blob_allocator;
        a = local_130;
LAB_003bf79a:
        iVar39 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                           (a,pMVar48,c,pOVar46);
        return iVar39;
      case 3:
        if (a[1].dims == 3) {
          local_7c = (uint)local_138 ^ 1;
          local_148 = CONCAT44(local_148._4_4_,uVar57) ^ 1;
          if (uVar5 == uVar56 && (local_7c == 0 && uVar57 == 1)) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,local_108,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_120 < 1) {
              return 0;
            }
            local_150 = (Mat *)0x0;
            do {
              local_c0._0_32_ =
                   *(undefined1 (*) [32])
                    ((long)local_130[1].data +
                    local_130[1].cstep * (long)local_150 * local_130[1].elemsize);
              if (0 < (int)local_128) {
                local_138 = (__m512 *)((long)c->data + c->cstep * c->elemsize * (long)local_150);
                local_158 = (Option *)
                            ((long)local_130->data +
                            local_130->cstep * local_130->elemsize * (long)local_150);
                lVar63 = 0;
                iVar39 = (int)local_128;
                do {
                  pauVar61 = (undefined1 (*) [32])((long)local_158 + lVar63);
                  uVar73 = *(undefined8 *)*pauVar61;
                  uVar80 = *(undefined8 *)(*pauVar61 + 8);
                  uVar81 = *(undefined8 *)(*pauVar61 + 0x10);
                  uVar82 = *(undefined8 *)(*pauVar61 + 0x18);
                  local_100._0_32_ = *pauVar61;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                  puVar60 = (undefined8 *)((long)local_138 + lVar63);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  lVar63 = lVar63 + 0x20;
                  iVar39 = iVar39 + -1;
                } while (iVar39 != 0);
              }
              local_150 = (Mat *)((long)local_150 + 1);
            } while (local_150 != (Mat *)local_120);
            return 0;
          }
          if ((uint)local_138 == uVar62) {
            if (_elempack == 1 && (uVar5 == 1 && uVar57 == uVar40)) {
              local_130 = a;
              Mat::create(c,uVar62,uVar40,uVar56,local_108,iVar39,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_120 < 1) {
                return 0;
              }
              local_140 = (__m512 *)0x0;
              do {
                if (0 < (int)local_128) {
                  local_158 = (Option *)(c->cstep * c->elemsize * (long)local_140 + (long)c->data);
                  local_150 = (Mat *)local_130[1].data;
                  local_138 = (__m512 *)
                              (local_130->cstep * local_130->elemsize * (long)local_140 +
                              (long)local_130->data);
                  lVar63 = 0;
                  iVar39 = (int)local_128;
                  do {
                    local_c0._0_32_ = *(undefined1 (*) [32])((long)local_138 + lVar63 * 8);
                    uVar1 = *(undefined4 *)((long)local_150 + lVar63);
                    auVar69._4_4_ = uVar1;
                    auVar69._0_4_ = uVar1;
                    auVar69._8_4_ = uVar1;
                    auVar69._12_4_ = uVar1;
                    auVar69._16_4_ = uVar1;
                    auVar69._20_4_ = uVar1;
                    auVar69._24_4_ = uVar1;
                    auVar69._28_4_ = uVar1;
                    local_100[0] = (float)uVar1;
                    local_100[1] = (float)uVar1;
                    local_100[2] = (float)uVar1;
                    local_100[3] = (float)uVar1;
                    local_100[4] = (float)uVar1;
                    local_100[5] = (float)uVar1;
                    local_100[6] = (float)uVar1;
                    local_100[7] = (float)uVar1;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                    *(undefined1 (*) [32])((long)local_158 + lVar63 * 8) = auVar69;
                    lVar63 = lVar63 + 4;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                local_140 = (__m512 *)((long)local_140 + 1);
              } while (local_140 != (__m512 *)local_120);
              return 0;
            }
            local_128 = CONCAT71(local_128._1_7_,uVar62 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar5 == uVar56) {
LAB_003c82bf:
              local_130 = a;
              Mat::create(c,(uint)local_138,uVar57,uVar5,sVar7,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_118 < 1) {
                return 0;
              }
              local_150 = (Mat *)0x0;
              do {
                local_c0._0_32_ =
                     *(undefined1 (*) [32])
                      ((long)local_130->data +
                      local_130->cstep * (long)local_150 * local_130->elemsize);
                if (0 < (int)local_10c) {
                  local_138 = (__m512 *)((long)c->data + c->cstep * c->elemsize * (long)local_150);
                  local_158 = (Option *)
                              ((long)local_130[1].data +
                              local_130[1].cstep * local_130[1].elemsize * (long)local_150);
                  lVar63 = 0;
                  uVar62 = local_10c;
                  do {
                    pauVar61 = (undefined1 (*) [32])((long)local_158 + lVar63);
                    uVar73 = *(undefined8 *)*pauVar61;
                    uVar80 = *(undefined8 *)(*pauVar61 + 8);
                    uVar81 = *(undefined8 *)(*pauVar61 + 0x10);
                    uVar82 = *(undefined8 *)(*pauVar61 + 0x18);
                    local_100._0_32_ = *pauVar61;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                    puVar60 = (undefined8 *)((long)local_138 + lVar63);
                    *puVar60 = uVar73;
                    puVar60[1] = uVar80;
                    puVar60[2] = uVar81;
                    puVar60[3] = uVar82;
                    lVar63 = lVar63 + 0x20;
                    uVar62 = uVar62 - 1;
                  } while (uVar62 != 0);
                }
                local_150 = (Mat *)((long)local_150 + 1);
              } while (local_150 != (Mat *)local_118);
              return 0;
            }
            if (iVar39 == 1 && (uVar56 == 1 && uVar57 == uVar40)) {
              local_130 = a;
              Mat::create(c,uVar62,uVar40,uVar5,sVar7,_elempack,opt->blob_allocator);
              if (c->data == (void *)0x0) {
                return -100;
              }
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_118 < 1) {
                return 0;
              }
              local_140 = (__m512 *)0x0;
              do {
                if (0 < (int)local_10c) {
                  local_138 = (__m512 *)local_130->data;
                  local_158 = (Option *)(c->cstep * c->elemsize * (long)local_140 + (long)c->data);
                  local_150 = (Mat *)(local_130[1].cstep * local_130[1].elemsize * (long)local_140 +
                                     (long)local_130[1].data);
                  lVar63 = 0;
                  uVar62 = local_10c;
                  do {
                    afVar72 = local_c0;
                    local_c0[1] = *(float *)((long)local_138 + lVar63);
                    local_c0[0] = local_c0[1];
                    local_c0[2] = local_c0[1];
                    local_c0[3] = local_c0[1];
                    local_c0[4] = local_c0[1];
                    local_c0[5] = local_c0[1];
                    local_c0[6] = local_c0[1];
                    local_c0._32_32_ = afVar72._32_32_;
                    local_c0[7] = local_c0[1];
                    auVar69 = *(undefined1 (*) [32])((long)local_150 + lVar63 * 8);
                    local_100[0] = (float)auVar69._0_4_;
                    local_100[1] = (float)auVar69._4_4_;
                    local_100[2] = (float)auVar69._8_4_;
                    local_100[3] = (float)auVar69._12_4_;
                    local_100[4] = (float)auVar69._16_4_;
                    local_100[5] = (float)auVar69._20_4_;
                    local_100[6] = (float)auVar69._24_4_;
                    local_100[7] = (float)auVar69._28_4_;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                    *(undefined1 (*) [32])((long)local_158 + lVar63 * 8) = auVar69;
                    lVar63 = lVar63 + 4;
                    uVar62 = uVar62 - 1;
                  } while (uVar62 != 0);
                }
                local_140 = (__m512 *)((long)local_140 + 1);
              } while (local_140 != (__m512 *)local_118);
              return 0;
            }
          }
          else {
            local_128 = CONCAT71(local_128._1_7_,uVar62 == 1);
            if ((uVar62 == 1 && uVar40 == 1) && uVar5 == uVar56) goto LAB_003c82bf;
          }
          local_10c._1_3_ = (undefined3)(local_10c >> 8);
          local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
          if (((local_7c == 0 && uVar57 == uVar40) && uVar56 == uVar5) && uVar62 != 1) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,local_108,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_120 < 1) {
              return 0;
            }
            local_148 = 0;
            do {
              if (0 < (int)local_150) {
                local_138 = (__m512 *)
                            (local_130[1].cstep * local_148 * local_130[1].elemsize +
                            (long)local_130[1].data);
                pauVar66 = (undefined1 (*) [32])(c->cstep * local_148 * c->elemsize + (long)c->data)
                ;
                pauVar61 = (undefined1 (*) [32])
                           (local_130->cstep * local_148 * local_130->elemsize +
                           (long)local_130->data);
                local_158 = (Option *)0x0;
                do {
                  local_c0._0_32_ = *(undefined1 (*) [32])((long)local_138 + (long)local_158 * 0x20)
                  ;
                  uVar41 = (ulong)local_140 & 0xffffffff;
                  if (0 < (int)local_140) {
                    do {
                      auVar69 = *pauVar61;
                      local_100[0] = (float)auVar69._0_4_;
                      local_100[1] = (float)auVar69._4_4_;
                      local_100[2] = (float)auVar69._8_4_;
                      local_100[3] = (float)auVar69._12_4_;
                      local_100[4] = (float)auVar69._16_4_;
                      local_100[5] = (float)auVar69._20_4_;
                      local_100[6] = (float)auVar69._24_4_;
                      local_100[7] = (float)auVar69._28_4_;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                      *pauVar66 = auVar69;
                      pauVar61 = pauVar61 + 1;
                      pauVar66 = pauVar66 + 1;
                      uVar62 = (int)uVar41 - 1;
                      uVar41 = (ulong)uVar62;
                    } while (uVar62 != 0);
                  }
                  local_158 = (Option *)((long)local_158 + 1);
                } while ((Mat *)local_158 != local_150);
              }
              local_148 = local_148 + 1;
            } while (local_148 != local_120);
            return 0;
          }
          if ((((uint)local_138 == uVar62 && (int)local_148 == 0) && uVar56 == uVar5) && uVar40 != 1
             ) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,local_108,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_120 < 1) {
              return 0;
            }
            lVar63 = (long)local_140 << 5;
            local_148 = 0;
            local_138 = (__m512 *)lVar63;
            do {
              if (0 < (int)local_150) {
                pvVar68 = (void *)(c->cstep * local_148 * c->elemsize + (long)c->data);
                pvVar64 = (void *)(local_130->cstep * local_148 * local_130->elemsize +
                                  (long)local_130->data);
                lVar67 = local_130[1].elemsize * local_130[1].cstep * local_148;
                pvVar49 = local_130[1].data;
                iVar39 = 0;
                pafVar58 = local_140;
                pMVar48 = local_150;
                do {
                  if (0 < (int)pafVar58) {
                    local_158 = (Option *)CONCAT44(local_158._4_4_,iVar39);
                    lVar59 = 0;
                    do {
                      local_c0._0_32_ = *(undefined1 (*) [32])((long)pvVar64 + lVar59);
                      auVar69 = *(undefined1 (*) [32])((long)pvVar49 + lVar59 + lVar67);
                      local_100[0] = (float)auVar69._0_4_;
                      local_100[1] = (float)auVar69._4_4_;
                      local_100[2] = (float)auVar69._8_4_;
                      local_100[3] = (float)auVar69._12_4_;
                      local_100[4] = (float)auVar69._16_4_;
                      local_100[5] = (float)auVar69._20_4_;
                      local_100[6] = (float)auVar69._24_4_;
                      local_100[7] = (float)auVar69._28_4_;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                      *(undefined1 (*) [32])((long)pvVar68 + lVar59) = auVar69;
                      lVar59 = lVar59 + 0x20;
                    } while (lVar63 != lVar59);
                    pvVar68 = (void *)((long)pvVar68 + lVar59);
                    pvVar64 = (void *)((long)pvVar64 + lVar59);
                    pafVar58 = local_140;
                    pMVar48 = local_150;
                    iVar39 = (uint)local_158;
                  }
                  iVar39 = iVar39 + 1;
                } while (iVar39 != (int)pMVar48);
              }
              local_148 = local_148 + 1;
            } while (local_148 != local_120);
            return 0;
          }
          if (((uVar5 == uVar56 && uVar57 == uVar40) & (uint)local_138 != 1 & (byte)local_128) == 1)
          {
            local_130 = a;
            Mat::create(c,(uint)local_138,uVar40,uVar56,sVar7,_elempack,opt->blob_allocator);
            if (c->data != (void *)0x0) {
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_120 < 1) {
                return 0;
              }
              local_148 = 0;
              do {
                if (0 < (int)local_150) {
                  local_140 = (__m512 *)
                              (local_130->cstep * local_148 * local_130->elemsize +
                              (long)local_130->data);
                  pauVar61 = (undefined1 (*) [32])
                             (c->cstep * local_148 * c->elemsize + (long)c->data);
                  pauVar66 = (undefined1 (*) [32])
                             (local_130[1].cstep * local_148 * local_130[1].elemsize +
                             (long)local_130[1].data);
                  local_158 = (Option *)0x0;
                  do {
                    local_c0._0_32_ =
                         *(undefined1 (*) [32])((long)local_140 + (long)local_158 * 0x20);
                    uVar62 = (uint)local_138;
                    if (0 < (int)(uint)local_138) {
                      do {
                        auVar69 = *pauVar66;
                        local_100[0] = (float)auVar69._0_4_;
                        local_100[1] = (float)auVar69._4_4_;
                        local_100[2] = (float)auVar69._8_4_;
                        local_100[3] = (float)auVar69._12_4_;
                        local_100[4] = (float)auVar69._16_4_;
                        local_100[5] = (float)auVar69._20_4_;
                        local_100[6] = (float)auVar69._24_4_;
                        local_100[7] = (float)auVar69._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                        *pauVar61 = auVar69;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar62 = uVar62 - 1;
                      } while (uVar62 != 0);
                    }
                    local_158 = (Option *)((long)local_158 + 1);
                  } while ((Mat *)local_158 != local_150);
                }
                local_148 = local_148 + 1;
              } while (local_148 != local_120);
              return 0;
            }
          }
          else {
            pOVar46 = (Option *)opt->blob_allocator;
            local_130 = a;
            if ((uVar40 != 1 || uVar5 != uVar56) || (uVar57 == 1 || (uint)local_138 != uVar62))
            goto LAB_003bf79a;
            Mat::create(c,uVar62,uVar57,uVar56,sVar7,_elempack,(Allocator *)pOVar46);
            if (c->data != (void *)0x0) {
              if ((long)c->c * c->cstep == 0) {
                return -100;
              }
              if ((int)local_120 < 1) {
                return 0;
              }
              lVar63 = (long)local_140 << 5;
              local_128 = 0;
              local_148 = lVar63;
              do {
                uVar41 = local_120;
                if (0 < (int)(uint)local_158) {
                  pvVar49 = (void *)(c->cstep * local_128 * c->elemsize + (long)c->data);
                  pvVar64 = (void *)(local_130[1].cstep * local_128 * local_130[1].elemsize +
                                    (long)local_130[1].data);
                  local_150 = (Mat *)(local_130->elemsize * local_130->cstep * local_128 +
                                     (long)local_130->data);
                  local_138._0_4_ = 0;
                  pafVar58 = local_140;
                  do {
                    pMVar48 = local_150;
                    if (0 < (int)pafVar58) {
                      lVar67 = 0;
                      do {
                        local_c0._0_32_ = *(undefined1 (*) [32])((long)pMVar48 + lVar67);
                        auVar69 = *(undefined1 (*) [32])((long)pvVar64 + lVar67);
                        local_100[0] = (float)auVar69._0_4_;
                        local_100[1] = (float)auVar69._4_4_;
                        local_100[2] = (float)auVar69._8_4_;
                        local_100[3] = (float)auVar69._12_4_;
                        local_100[4] = (float)auVar69._16_4_;
                        local_100[5] = (float)auVar69._20_4_;
                        local_100[6] = (float)auVar69._24_4_;
                        local_100[7] = (float)auVar69._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                        *(undefined1 (*) [32])((long)pvVar49 + lVar67) = auVar69;
                        lVar67 = lVar67 + 0x20;
                      } while (lVar63 != lVar67);
                      pvVar49 = (void *)((long)pvVar49 + lVar67);
                      pvVar64 = (void *)((long)pvVar64 + lVar67);
                      uVar41 = local_120;
                      pafVar58 = local_140;
                    }
                    local_138._0_4_ = (uint)local_138 + 1;
                  } while ((uint)local_138 != (uint)local_158);
                }
                local_128 = local_128 + 1;
              } while (local_128 != uVar41);
              return 0;
            }
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,(uint)local_138,uVar57,iVar4,uVar5,sVar7,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_118 < 1) {
            return 0;
          }
          local_120 = 0;
          do {
            if (0 < (int)local_148) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * local_120 * c->elemsize + (long)c->data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130[1].cstep * local_120 * local_130[1].elemsize +
                         (long)local_130[1].data);
              local_150 = (Mat *)(local_130->cstep * local_120 * local_130->elemsize +
                                 (long)local_130->data);
              iVar39 = 0;
              do {
                local_128 = CONCAT44(local_128._4_4_,iVar39);
                if (0 < (int)(uint)local_158) {
                  iVar39 = 0;
                  do {
                    local_140 = (__m512 *)CONCAT44(local_140._4_4_,iVar39);
                    local_c0._0_32_ = *(undefined1 (*) [32])local_150;
                    uVar62 = (uint)local_138;
                    if (0 < (int)(uint)local_138) {
                      do {
                        auVar69 = *pauVar66;
                        local_100[0] = (float)auVar69._0_4_;
                        local_100[1] = (float)auVar69._4_4_;
                        local_100[2] = (float)auVar69._8_4_;
                        local_100[3] = (float)auVar69._12_4_;
                        local_100[4] = (float)auVar69._16_4_;
                        local_100[5] = (float)auVar69._20_4_;
                        local_100[6] = (float)auVar69._24_4_;
                        local_100[7] = (float)auVar69._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_159,(__m256 *)local_c0,(__m256 *)local_100);
                        *pauVar61 = auVar69;
                        pauVar66 = pauVar66 + 1;
                        pauVar61 = pauVar61 + 1;
                        uVar62 = uVar62 - 1;
                      } while (uVar62 != 0);
                    }
                    local_150 = (Mat *)((long)local_150 + 0x20);
                    iVar39 = (int)local_140 + 1;
                  } while (iVar39 != (uint)local_158);
                }
                iVar39 = (int)local_128 + 1;
              } while (iVar39 != (int)local_148);
            }
            local_120 = local_120 + 1;
          } while (local_120 != local_118);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,local_108,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)local_120 < 1) {
            return 0;
          }
          local_148 = 0;
          do {
            if (0 < (int)local_150) {
              pauVar61 = (undefined1 (*) [32])(c->cstep * local_148 * c->elemsize + (long)c->data);
              local_158 = (Option *)
                          ((long)local_130[1].w * local_148 * local_130[1].elemsize +
                          (long)local_130[1].data);
              pauVar66 = (undefined1 (*) [32])
                         (local_130->cstep * local_148 * local_130->elemsize + (long)local_130->data
                         );
              local_138._0_4_ = 0;
              do {
                local_c0._0_32_ = local_158->lightmode;
                uVar41 = (ulong)local_140 & 0xffffffff;
                if (0 < (int)local_140) {
                  do {
                    auVar69 = *pauVar66;
                    local_100[0] = (float)auVar69._0_4_;
                    local_100[1] = (float)auVar69._4_4_;
                    local_100[2] = (float)auVar69._8_4_;
                    local_100[3] = (float)auVar69._12_4_;
                    local_100[4] = (float)auVar69._16_4_;
                    local_100[5] = (float)auVar69._20_4_;
                    local_100[6] = (float)auVar69._24_4_;
                    local_100[7] = (float)auVar69._28_4_;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                    *pauVar61 = auVar69;
                    pauVar66 = pauVar66 + 1;
                    pauVar61 = pauVar61 + 1;
                    uVar62 = (int)uVar41 - 1;
                    uVar41 = (ulong)uVar62;
                  } while (uVar62 != 0);
                }
                local_158 = (Option *)((long)local_158 + 0x20);
                local_138._0_4_ = (uint)local_138 + 1;
              } while ((uint)local_138 != (int)local_150);
            }
            local_148 = local_148 + 1;
          } while (local_148 != local_120);
          return 0;
        }
        if (_elempack != 1 || local_130[1].w != 1) {
          if ((int)local_120 < 1) {
            return 0;
          }
          local_150 = (Mat *)0x0;
          do {
            local_c0._0_32_ =
                 *(undefined1 (*) [32])((long)local_130[1].data + (long)local_150 * 0x20);
            if (0 < (int)local_128) {
              local_138 = (__m512 *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
              local_158 = (Option *)
                          ((long)local_130->data +
                          local_130->cstep * local_130->elemsize * (long)local_150);
              lVar63 = 0;
              iVar39 = (int)local_128;
              do {
                pauVar61 = (undefined1 (*) [32])((long)local_158 + lVar63);
                uVar73 = *(undefined8 *)*pauVar61;
                uVar80 = *(undefined8 *)(*pauVar61 + 8);
                uVar81 = *(undefined8 *)(*pauVar61 + 0x10);
                uVar82 = *(undefined8 *)(*pauVar61 + 0x18);
                local_100._0_32_ = *pauVar61;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                puVar60 = (undefined8 *)((long)local_138 + lVar63);
                *puVar60 = uVar73;
                puVar60[1] = uVar80;
                puVar60[2] = uVar81;
                puVar60[3] = uVar82;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            local_150 = (Mat *)((long)local_150 + 1);
          } while (local_150 != (Mat *)local_120);
          return 0;
        }
        break;
      case 4:
        local_148 = CONCAT44(local_148._4_4_,iVar43);
        pOVar46 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003bf79a;
        local_130 = a;
        Mat::create(c,uVar62,uVar40,iVar43,uVar56,local_108,iVar39,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        iVar39 = local_130[1].dims;
        iVar43 = (int)local_120;
        if (iVar39 != 1) {
          if (iVar39 == 3) {
            if (iVar43 < 1) {
              return 0;
            }
            local_118 = 0;
            do {
              if (0 < (int)local_148) {
                pauVar61 = (undefined1 (*) [32])(c->cstep * local_118 * c->elemsize + (long)c->data)
                ;
                local_158 = (Option *)
                            (local_130[1].cstep * local_118 * local_130[1].elemsize +
                            (long)local_130[1].data);
                pauVar66 = (undefined1 (*) [32])
                           (local_130->cstep * local_118 * local_130->elemsize +
                           (long)local_130->data);
                iVar39 = 0;
                pafVar58 = local_140;
                pMVar48 = local_150;
                do {
                  local_128 = CONCAT44(local_128._4_4_,iVar39);
                  if (0 < (int)pMVar48) {
                    local_138._0_4_ = 0;
                    do {
                      local_c0._0_32_ = local_158->lightmode;
                      uVar41 = (ulong)pafVar58 & 0xffffffff;
                      if (0 < (int)pafVar58) {
                        do {
                          auVar69 = *pauVar66;
                          local_100[0] = (float)auVar69._0_4_;
                          local_100[1] = (float)auVar69._4_4_;
                          local_100[2] = (float)auVar69._8_4_;
                          local_100[3] = (float)auVar69._12_4_;
                          local_100[4] = (float)auVar69._16_4_;
                          local_100[5] = (float)auVar69._20_4_;
                          local_100[6] = (float)auVar69._24_4_;
                          local_100[7] = (float)auVar69._28_4_;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                    (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                          *pauVar61 = auVar69;
                          pauVar66 = pauVar66 + 1;
                          pauVar61 = pauVar61 + 1;
                          uVar62 = (int)uVar41 - 1;
                          uVar41 = (ulong)uVar62;
                        } while (uVar62 != 0);
                      }
                      local_158 = (Option *)((long)local_158 + 0x20);
                      local_138._0_4_ = (uint)local_138 + 1;
                      pafVar58 = local_140;
                      pMVar48 = local_150;
                    } while ((uint)local_138 != (int)local_150);
                  }
                  iVar39 = (int)local_128 + 1;
                } while (iVar39 != (int)local_148);
              }
              local_118 = local_118 + 1;
            } while (local_118 != local_120);
            return 0;
          }
          if (iVar39 == 2) {
            if (iVar43 < 1) {
              return 0;
            }
            local_118 = 0;
            do {
              if (0 < (int)local_148) {
                pauVar61 = (undefined1 (*) [32])(c->cstep * local_118 * c->elemsize + (long)c->data)
                ;
                local_138 = (__m512 *)
                            ((long)local_130[1].w * local_118 * local_130[1].elemsize +
                            (long)local_130[1].data);
                pauVar66 = (undefined1 (*) [32])
                           (local_130->cstep * local_118 * local_130->elemsize +
                           (long)local_130->data);
                iVar39 = 0;
                pafVar58 = local_140;
                pMVar48 = local_150;
                do {
                  local_128 = CONCAT44(local_128._4_4_,iVar39);
                  local_c0._0_32_ = *(undefined1 (*) [32])local_138;
                  if (0 < (int)pMVar48) {
                    iVar39 = 0;
                    do {
                      local_158 = (Option *)CONCAT44(local_158._4_4_,iVar39);
                      uVar41 = (ulong)pafVar58 & 0xffffffff;
                      if (0 < (int)pafVar58) {
                        do {
                          auVar69 = *pauVar66;
                          local_100[0] = (float)auVar69._0_4_;
                          local_100[1] = (float)auVar69._4_4_;
                          local_100[2] = (float)auVar69._8_4_;
                          local_100[3] = (float)auVar69._12_4_;
                          local_100[4] = (float)auVar69._16_4_;
                          local_100[5] = (float)auVar69._20_4_;
                          local_100[6] = (float)auVar69._24_4_;
                          local_100[7] = (float)auVar69._28_4_;
                          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                    (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                          *pauVar61 = auVar69;
                          pauVar66 = pauVar66 + 1;
                          pauVar61 = pauVar61 + 1;
                          uVar62 = (int)uVar41 - 1;
                          uVar41 = (ulong)uVar62;
                        } while (uVar62 != 0);
                      }
                      iVar39 = (uint)local_158 + 1;
                      pafVar58 = local_140;
                      pMVar48 = local_150;
                    } while (iVar39 != (int)local_150);
                  }
                  local_138 = (__m512 *)((long)local_138 + 0x20);
                  iVar39 = (int)local_128 + 1;
                } while (iVar39 != (int)local_148);
              }
              local_118 = local_118 + 1;
            } while (local_118 != local_120);
            return 0;
          }
          return 0;
        }
        if (_elempack != 1 || local_130[1].w != 1) {
          if (iVar43 < 1) {
            return 0;
          }
          local_150 = (Mat *)0x0;
          do {
            local_c0._0_32_ =
                 *(undefined1 (*) [32])((long)local_130[1].data + (long)local_150 * 0x20);
            if (0 < (int)local_128) {
              local_158 = (Option *)
                          ((long)local_130->data +
                          local_130->cstep * local_130->elemsize * (long)local_150);
              local_138 = (__m512 *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
              lVar63 = 0;
              iVar39 = (int)local_128;
              do {
                pauVar61 = (undefined1 (*) [32])((long)local_158 + lVar63);
                uVar73 = *(undefined8 *)*pauVar61;
                uVar80 = *(undefined8 *)(*pauVar61 + 8);
                uVar81 = *(undefined8 *)(*pauVar61 + 0x10);
                uVar82 = *(undefined8 *)(*pauVar61 + 0x18);
                local_100._0_32_ = *pauVar61;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_159,(__m256 *)local_100,(__m256 *)local_c0);
                puVar60 = (undefined8 *)((long)local_138 + lVar63);
                *puVar60 = uVar73;
                puVar60[1] = uVar80;
                puVar60[2] = uVar81;
                puVar60[3] = uVar82;
                lVar63 = lVar63 + 0x20;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            local_150 = (Mat *)((long)local_150 + 1);
          } while (local_150 != (Mat *)local_120);
          return 0;
        }
      }
      goto LAB_003c7d7f;
    case 7:
      pMVar50 = a;
      a = pMVar48;
      break;
    case 8:
      pMVar50 = a;
      a = pMVar48;
LAB_003bdc0f:
      iVar39 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>(a,pMVar50,c,opt);
      return iVar39;
    default:
      goto switchD_003bd322_default;
    }
    iVar39 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(a,pMVar50,c,opt);
    return iVar39;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)pp_Var6[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
    local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
    uVar62 = a->w;
    uVar40 = a->h;
    iVar43 = a->d;
    uVar56 = a->c;
    uVar41 = (ulong)uVar56;
    local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
    sVar7 = a->elemsize;
    uVar57 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar42 = (ulong)uVar3;
    iVar54 = uVar5 * uVar57 * iVar4;
    sVar8 = a[1].elemsize;
    local_128 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar39 != 1 || uVar62 != 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar44 = (undefined1 (*) [64])c->data;
          if (pauVar44 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])a->data;
          pauVar51 = (undefined1 (*) [64])a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar71 = *pauVar47;
              uVar40 = uVar57;
              do {
                auVar70 = vaddps_avx512f(auVar71,*pauVar51);
                *pauVar44 = auVar70;
                pauVar51 = pauVar51 + 1;
                pauVar44 = pauVar44 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar47 = pauVar47 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar70 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar70 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7d58;
      }
      goto LAB_003bd3b4;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
            pauVar51 = (undefined1 (*) [64])((long)a->w * uVar41 * a->elemsize + (long)a->data);
            uVar62 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *pauVar51;
                uVar40 = uVar57;
                do {
                  auVar70 = vaddps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar40 = uVar40 - 1;
                } while (uVar40 != 0);
              }
              pauVar51 = pauVar51 + 1;
              uVar62 = uVar62 + 1;
            } while (uVar62 != uVar5);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      if (a[1].dims == 4) {
        local_130 = a;
        Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < iVar4) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                       (long)local_130[1].data);
            pauVar51 = (undefined1 (*) [64])
                       ((long)local_130->w * uVar41 * local_130->elemsize + (long)local_130->data);
            iVar39 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar71 = *pauVar51;
                uVar62 = 0;
                do {
                  uVar40 = uVar57;
                  if (0 < (int)uVar57) {
                    do {
                      auVar70 = vaddps_avx512f(auVar71,*pauVar47);
                      *pauVar44 = auVar70;
                      pauVar47 = pauVar47 + 1;
                      pauVar44 = pauVar44 + 1;
                      uVar40 = uVar40 - 1;
                    } while (uVar40 != 0);
                  }
                  uVar62 = uVar62 + 1;
                } while (uVar62 != uVar5);
              }
              pauVar51 = pauVar51 + 1;
              iVar39 = iVar39 + 1;
            } while (iVar39 != iVar4);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      local_130 = a;
      Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = local_130[1].dims;
      if (iVar39 == 1) {
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pauVar44 = (undefined1 (*) [64])c->data;
        if (pauVar44 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])local_130->data;
          pauVar51 = (undefined1 (*) [64])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar71 = *pauVar51;
              uVar57 = uVar62;
              do {
                auVar70 = vaddps_avx512f(auVar71,*pauVar47);
                *pauVar44 = auVar70;
                pauVar47 = pauVar47 + 1;
                pauVar44 = pauVar44 + 1;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar51 = pauVar51 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      }
LAB_003c277e:
      if (iVar39 != 2) {
        return 0;
      }
      pOVar46 = (Option *)local_158->blob_allocator;
      a = local_130;
LAB_003bf390:
      iVar39 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                         (a,local_150,c,pOVar46);
      return iVar39;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar4) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar41 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar71 = *pauVar51;
                      uVar40 = uVar57;
                      do {
                        auVar70 = vaddps_avx512f(auVar71,*pauVar47);
                        *pauVar44 = auVar70;
                        pauVar47 = pauVar47 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar40) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)local_130[1].w * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar71 = *pauVar47;
                  uVar57 = uVar62;
                  do {
                    auVar70 = vaddps_avx512f(auVar71,*pauVar51);
                    *pauVar44 = auVar70;
                    pauVar51 = pauVar51 + 1;
                    pauVar44 = pauVar44 + 1;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar47 = pauVar47 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        break;
      }
      local_118 = sVar8;
      if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = c->cstep;
            sVar8 = c->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)a[1].data + a[1].cstep * uVar42 * a[1].elemsize);
            pvVar49 = c->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar64 = a->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42))
              ;
              *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      local_120 = uVar42;
      if (uVar57 == uVar62) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              sVar10 = a->cstep;
              pvVar49 = c->data;
              pvVar64 = a[1].data;
              sVar11 = a->elemsize;
              pvVar68 = a->data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar64 + lVar67 * 4)));
                auVar71 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar68 +
                                                  lVar63 * 4 + sVar10 * sVar11 * uVar42));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 * 4 + sVar7 * sVar8 * uVar42) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_148 = CONCAT44(local_148._4_4_,iVar54);
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c6955:
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + a->cstep * uVar41 * a->elemsize);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
          Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              pvVar49 = a->data;
              pvVar64 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar68 = a[1].data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar49 + lVar67 * 4)));
                auVar71 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar68 +
                                                  lVar63 * 4 + sVar10 * sVar11 * uVar41));
                *(undefined1 (*) [64])((long)pvVar64 + lVar63 * 4 + sVar7 * sVar8 * uVar41) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      else {
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c6955;
      }
      local_148 = CONCAT44(local_148._4_4_,iVar54);
      if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar49 = a[1].data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar62) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar56 = uVar62;
                do {
                  auVar70 = vaddps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar56 = uVar56 - 1;
                } while (uVar56 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(a->cstep * uVar42 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar49 = a[1].data;
            uVar56 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vaddps_avx512f(*(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42),
                                           *(undefined1 (*) [64])((long)pvVar68 + lVar63));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar56 = uVar56 + 1;
            } while (uVar56 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
        local_130 = a;
        Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = local_130->cstep;
            sVar8 = local_130->elemsize;
            pvVar49 = local_130->data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                       (long)local_130[1].data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar62 = uVar57;
                do {
                  auVar70 = vaddps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      pOVar46 = (Option *)opt->blob_allocator;
      local_130 = a;
      if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
        Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_130->elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                              (long)local_130[1].data);
            sVar8 = local_130->cstep;
            pvVar49 = local_130->data;
            uVar40 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar68 + lVar63),
                                           *(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != uVar5);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
LAB_003bf388:
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      goto LAB_003bf390;
    case 4:
      pOVar46 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003bf388;
      Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = a[1].dims;
      if (iVar39 != 1) {
        if (iVar39 == 3) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      auVar71 = *pauVar47;
                      uVar57 = uVar62;
                      do {
                        auVar70 = vaddps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    pauVar47 = pauVar47 + 1;
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (iVar39 == 2) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)a[1].w * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  auVar71 = *pauVar47;
                  uVar56 = 0;
                  do {
                    uVar57 = uVar62;
                    if (0 < (int)uVar62) {
                      do {
                        auVar70 = vaddps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                pauVar47 = pauVar47 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        return 0;
      }
      if ((int)local_140 != 1 || a[1].w != 1) {
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
            pvVar49 = a->data;
            sVar10 = c->cstep;
            sVar11 = c->elemsize;
            pvVar64 = c->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vaddps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
              *(undefined1 (*) [64])((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
    }
LAB_003c7d4f:
    pOVar46 = (Option *)local_158->blob_allocator;
LAB_003c7d58:
    iVar39 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                       (a,local_150,c,pOVar46);
    return iVar39;
  case 1:
    pMVar50 = pMVar48;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
    local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
    uVar62 = a->w;
    uVar40 = a->h;
    iVar43 = a->d;
    uVar56 = a->c;
    uVar41 = (ulong)uVar56;
    local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
    sVar7 = a->elemsize;
    uVar57 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar42 = (ulong)uVar3;
    iVar54 = uVar5 * uVar57 * iVar4;
    sVar8 = a[1].elemsize;
    local_128 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar39 != 1 || uVar62 != 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar44 = (undefined1 (*) [64])c->data;
          if (pauVar44 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])a->data;
          pauVar51 = (undefined1 (*) [64])a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar71 = *pauVar47;
              uVar40 = uVar57;
              do {
                auVar70 = vmulps_avx512f(auVar71,*pauVar51);
                *pauVar44 = auVar70;
                pauVar51 = pauVar51 + 1;
                pauVar44 = pauVar44 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar47 = pauVar47 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar70 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar70 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7c4a;
      }
      goto LAB_003bda61;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
            pauVar51 = (undefined1 (*) [64])((long)a->w * uVar41 * a->elemsize + (long)a->data);
            uVar62 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *pauVar51;
                uVar40 = uVar57;
                do {
                  auVar70 = vmulps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar40 = uVar40 - 1;
                } while (uVar40 != 0);
              }
              pauVar51 = pauVar51 + 1;
              uVar62 = uVar62 + 1;
            } while (uVar62 != uVar5);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      if (a[1].dims == 4) {
        local_130 = a;
        Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < iVar4) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                       (long)local_130[1].data);
            pauVar51 = (undefined1 (*) [64])
                       ((long)local_130->w * uVar41 * local_130->elemsize + (long)local_130->data);
            iVar39 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar71 = *pauVar51;
                uVar62 = 0;
                do {
                  uVar40 = uVar57;
                  if (0 < (int)uVar57) {
                    do {
                      auVar70 = vmulps_avx512f(auVar71,*pauVar47);
                      *pauVar44 = auVar70;
                      pauVar47 = pauVar47 + 1;
                      pauVar44 = pauVar44 + 1;
                      uVar40 = uVar40 - 1;
                    } while (uVar40 != 0);
                  }
                  uVar62 = uVar62 + 1;
                } while (uVar62 != uVar5);
              }
              pauVar51 = pauVar51 + 1;
              iVar39 = iVar39 + 1;
            } while (iVar39 != iVar4);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      local_130 = a;
      Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = local_130[1].dims;
      if (iVar39 == 1) {
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pauVar44 = (undefined1 (*) [64])c->data;
        if (pauVar44 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])local_130->data;
          pauVar51 = (undefined1 (*) [64])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar71 = *pauVar51;
              uVar57 = uVar62;
              do {
                auVar70 = vmulps_avx512f(auVar71,*pauVar47);
                *pauVar44 = auVar70;
                pauVar47 = pauVar47 + 1;
                pauVar44 = pauVar44 + 1;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar51 = pauVar51 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      }
LAB_003c2609:
      if (iVar39 != 2) {
        return 0;
      }
      pOVar46 = (Option *)local_158->blob_allocator;
      a = local_130;
LAB_003bf139:
      iVar39 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                         (a,local_150,c,pOVar46);
      return iVar39;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar4) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar41 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar71 = *pauVar51;
                      uVar40 = uVar57;
                      do {
                        auVar70 = vmulps_avx512f(auVar71,*pauVar47);
                        *pauVar44 = auVar70;
                        pauVar47 = pauVar47 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar40) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)local_130[1].w * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar71 = *pauVar47;
                  uVar57 = uVar62;
                  do {
                    auVar70 = vmulps_avx512f(auVar71,*pauVar51);
                    *pauVar44 = auVar70;
                    pauVar51 = pauVar51 + 1;
                    pauVar44 = pauVar44 + 1;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar47 = pauVar47 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        break;
      }
      local_118 = sVar8;
      if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = c->cstep;
            sVar8 = c->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)a[1].data + a[1].cstep * uVar42 * a[1].elemsize);
            pvVar49 = c->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar64 = a->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42))
              ;
              *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      local_120 = uVar42;
      if (uVar57 == uVar62) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              sVar10 = a->cstep;
              pvVar49 = c->data;
              pvVar64 = a[1].data;
              sVar11 = a->elemsize;
              pvVar68 = a->data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar64 + lVar67 * 4)));
                auVar71 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar68 +
                                                  lVar63 * 4 + sVar10 * sVar11 * uVar42));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 * 4 + sVar7 * sVar8 * uVar42) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_148 = CONCAT44(local_148._4_4_,iVar54);
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c6845:
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + a->cstep * uVar41 * a->elemsize);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
          Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              pvVar49 = a->data;
              pvVar64 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar68 = a[1].data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar49 + lVar67 * 4)));
                auVar71 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar68 +
                                                  lVar63 * 4 + sVar10 * sVar11 * uVar41));
                *(undefined1 (*) [64])((long)pvVar64 + lVar63 * 4 + sVar7 * sVar8 * uVar41) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      else {
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c6845;
      }
      local_148 = CONCAT44(local_148._4_4_,iVar54);
      if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar49 = a[1].data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar62) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar56 = uVar62;
                do {
                  auVar70 = vmulps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar56 = uVar56 - 1;
                } while (uVar56 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(a->cstep * uVar42 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar49 = a[1].data;
            uVar56 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vmulps_avx512f(*(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42),
                                           *(undefined1 (*) [64])((long)pvVar68 + lVar63));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar56 = uVar56 + 1;
            } while (uVar56 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
        local_130 = a;
        Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = local_130->cstep;
            sVar8 = local_130->elemsize;
            pvVar49 = local_130->data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                       (long)local_130[1].data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar62 = uVar57;
                do {
                  auVar70 = vmulps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      pOVar46 = (Option *)opt->blob_allocator;
      local_130 = a;
      if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
        Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_130->elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                              (long)local_130[1].data);
            sVar8 = local_130->cstep;
            pvVar49 = local_130->data;
            uVar40 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar68 + lVar63),
                                           *(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != uVar5);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
LAB_003bf131:
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      goto LAB_003bf139;
    case 4:
      pOVar46 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003bf131;
      Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = a[1].dims;
      if (iVar39 != 1) {
        if (iVar39 == 3) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      auVar71 = *pauVar47;
                      uVar57 = uVar62;
                      do {
                        auVar70 = vmulps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    pauVar47 = pauVar47 + 1;
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (iVar39 == 2) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)a[1].w * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  auVar71 = *pauVar47;
                  uVar56 = 0;
                  do {
                    uVar57 = uVar62;
                    if (0 < (int)uVar62) {
                      do {
                        auVar70 = vmulps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                pauVar47 = pauVar47 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        return 0;
      }
      if ((int)local_140 != 1 || a[1].w != 1) {
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
            pvVar49 = a->data;
            sVar10 = c->cstep;
            sVar11 = c->elemsize;
            pvVar64 = c->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vmulps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
              *(undefined1 (*) [64])((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
    }
LAB_003c7c41:
    pOVar46 = (Option *)local_158->blob_allocator;
LAB_003c7c4a:
    iVar39 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                       (a,local_150,c,pOVar46);
    return iVar39;
  case 3:
    pMVar50 = pMVar48;
    goto LAB_003bd913;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
    local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
    uVar62 = a->w;
    uVar40 = a->h;
    iVar43 = a->d;
    uVar56 = a->c;
    uVar41 = (ulong)uVar56;
    local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
    sVar7 = a->elemsize;
    uVar57 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar42 = (ulong)uVar3;
    iVar54 = uVar5 * uVar57 * iVar4;
    sVar8 = a[1].elemsize;
    local_128 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar39 == 1 && uVar62 == 1) goto LAB_003bd9b3;
      switch(a[1].dims) {
      case 1:
        Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        pOVar46 = (Option *)local_158->blob_allocator;
        if ((int)local_140 != 1 || a[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                    (a,local_150,c,pOVar46);
          return 0;
        }
        break;
      case 2:
        Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
        pauVar44 = (undefined1 (*) [64])c->data;
        if (pauVar44 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pauVar47 = (undefined1 (*) [64])a->data;
        pauVar51 = (undefined1 (*) [64])a[1].data;
        uVar62 = 0;
        do {
          if (0 < (int)uVar57) {
            auVar71 = *pauVar47;
            uVar40 = uVar57;
            do {
              auVar70 = vmaxps_avx512f(auVar71,*pauVar51);
              *pauVar44 = auVar70;
              pauVar51 = pauVar51 + 1;
              pauVar44 = pauVar44 + 1;
              uVar40 = uVar40 - 1;
            } while (uVar40 != 0);
          }
          pauVar47 = pauVar47 + 1;
          uVar62 = uVar62 + 1;
        } while (uVar62 != uVar5);
        return 0;
      case 3:
        Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < iVar54) {
            sVar7 = c->cstep;
            sVar8 = c->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
            pvVar49 = c->data;
            sVar10 = a[1].cstep;
            sVar11 = a[1].elemsize;
            pvVar64 = a[1].data;
            lVar63 = 0;
            iVar39 = iVar54;
            do {
              auVar70 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41))
              ;
              *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      case 4:
        Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < iVar54) {
            sVar7 = c->cstep;
            sVar8 = c->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
            pvVar49 = c->data;
            sVar10 = a[1].cstep;
            sVar11 = a[1].elemsize;
            pvVar64 = a[1].data;
            lVar63 = 0;
            iVar39 = iVar54;
            do {
              auVar70 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41))
              ;
              *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      default:
        goto LAB_003cade6;
      }
      goto LAB_003c7aad;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
            pauVar51 = (undefined1 (*) [64])((long)a->w * uVar41 * a->elemsize + (long)a->data);
            uVar62 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *pauVar51;
                uVar40 = uVar57;
                do {
                  auVar70 = vmaxps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar40 = uVar40 - 1;
                } while (uVar40 != 0);
              }
              pauVar51 = pauVar51 + 1;
              uVar62 = uVar62 + 1;
            } while (uVar62 != uVar5);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      if (a[1].dims == 4) {
        local_130 = a;
        Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < iVar4) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                       (long)local_130[1].data);
            pauVar51 = (undefined1 (*) [64])
                       ((long)local_130->w * uVar41 * local_130->elemsize + (long)local_130->data);
            iVar39 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar71 = *pauVar51;
                uVar62 = 0;
                do {
                  uVar40 = uVar57;
                  if (0 < (int)uVar57) {
                    do {
                      auVar70 = vmaxps_avx512f(auVar71,*pauVar47);
                      *pauVar44 = auVar70;
                      pauVar47 = pauVar47 + 1;
                      pauVar44 = pauVar44 + 1;
                      uVar40 = uVar40 - 1;
                    } while (uVar40 != 0);
                  }
                  uVar62 = uVar62 + 1;
                } while (uVar62 != uVar5);
              }
              pauVar51 = pauVar51 + 1;
              iVar39 = iVar39 + 1;
            } while (iVar39 != iVar4);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      local_130 = a;
      Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = local_130[1].dims;
      if (iVar39 == 1) {
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pauVar44 = (undefined1 (*) [64])c->data;
        if (pauVar44 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])local_130->data;
          pauVar51 = (undefined1 (*) [64])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar71 = *pauVar51;
              uVar57 = uVar62;
              do {
                auVar70 = vmaxps_avx512f(auVar71,*pauVar47);
                *pauVar44 = auVar70;
                pauVar47 = pauVar47 + 1;
                pauVar44 = pauVar44 + 1;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar51 = pauVar51 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      }
LAB_003c2180:
      if (iVar39 != 2) {
        return 0;
      }
      pOVar46 = (Option *)local_158->blob_allocator;
      a = local_130;
LAB_003beee2:
      iVar39 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                         (a,local_150,c,pOVar46);
      return iVar39;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar4) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar41 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar71 = *pauVar51;
                      uVar40 = uVar57;
                      do {
                        auVar70 = vmaxps_avx512f(auVar71,*pauVar47);
                        *pauVar44 = auVar70;
                        pauVar47 = pauVar47 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar40) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)local_130[1].w * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar71 = *pauVar47;
                  uVar57 = uVar62;
                  do {
                    auVar70 = vmaxps_avx512f(auVar71,*pauVar51);
                    *pauVar44 = auVar70;
                    pauVar51 = pauVar51 + 1;
                    pauVar44 = pauVar44 + 1;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar47 = pauVar47 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        break;
      }
      local_118 = sVar8;
      if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = c->cstep;
            sVar8 = c->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)a[1].data + a[1].cstep * uVar42 * a[1].elemsize);
            pvVar49 = c->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar64 = a->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42))
              ;
              *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      local_120 = uVar42;
      if (uVar57 == uVar62) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              sVar10 = a->cstep;
              pvVar49 = c->data;
              pvVar64 = a[1].data;
              sVar11 = a->elemsize;
              pvVar68 = a->data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                uVar1 = *(undefined4 *)((long)pvVar64 + lVar67 * 4);
                auVar70._4_4_ = uVar1;
                auVar70._0_4_ = uVar1;
                auVar70._8_4_ = uVar1;
                auVar70._12_4_ = uVar1;
                auVar70._16_4_ = uVar1;
                auVar70._20_4_ = uVar1;
                auVar70._24_4_ = uVar1;
                auVar70._28_4_ = uVar1;
                auVar70._32_4_ = uVar1;
                auVar70._36_4_ = uVar1;
                auVar70._40_4_ = uVar1;
                auVar70._44_4_ = uVar1;
                auVar70._48_4_ = uVar1;
                auVar70._52_4_ = uVar1;
                auVar70._56_4_ = uVar1;
                auVar70._60_4_ = uVar1;
                auVar71 = vmaxps_avx512f(*(undefined1 (*) [64])
                                          ((long)pvVar68 + lVar63 * 4 + sVar10 * sVar11 * uVar42),
                                         auVar70);
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 * 4 + sVar7 * sVar8 * uVar42) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_148 = CONCAT44(local_148._4_4_,iVar54);
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c6735:
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + a->cstep * uVar41 * a->elemsize);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
          Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              pvVar49 = a->data;
              pvVar64 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar68 = a[1].data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar49 + lVar67 * 4)));
                auVar71 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar68 +
                                                  lVar63 * 4 + sVar10 * sVar11 * uVar41));
                *(undefined1 (*) [64])((long)pvVar64 + lVar63 * 4 + sVar7 * sVar8 * uVar41) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      else {
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c6735;
      }
      local_148 = CONCAT44(local_148._4_4_,iVar54);
      if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar49 = a[1].data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar62) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar56 = uVar62;
                do {
                  auVar70 = vmaxps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar56 = uVar56 - 1;
                } while (uVar56 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(a->cstep * uVar42 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar49 = a[1].data;
            uVar56 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar68 + lVar63),
                                           *(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar56 = uVar56 + 1;
            } while (uVar56 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
        local_130 = a;
        Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = local_130->cstep;
            sVar8 = local_130->elemsize;
            pvVar49 = local_130->data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                       (long)local_130[1].data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar62 = uVar57;
                do {
                  auVar70 = vmaxps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      pOVar46 = (Option *)opt->blob_allocator;
      local_130 = a;
      if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
        Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_130->elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                              (long)local_130[1].data);
            sVar8 = local_130->cstep;
            pvVar49 = local_130->data;
            uVar40 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vmaxps_avx512f(*(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42),
                                           *(undefined1 (*) [64])((long)pvVar68 + lVar63));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != uVar5);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
LAB_003beeda:
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      goto LAB_003beee2;
    case 4:
      pOVar46 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003beeda;
      Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = a[1].dims;
      if (iVar39 != 1) {
        if (iVar39 == 3) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      auVar71 = *pauVar47;
                      uVar57 = uVar62;
                      do {
                        auVar70 = vmaxps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    pauVar47 = pauVar47 + 1;
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (iVar39 == 2) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)a[1].w * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  auVar71 = *pauVar47;
                  uVar56 = 0;
                  do {
                    uVar57 = uVar62;
                    if (0 < (int)uVar62) {
                      do {
                        auVar70 = vmaxps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                pauVar47 = pauVar47 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        return 0;
      }
      if ((int)local_140 != 1 || a[1].w != 1) {
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
            pvVar49 = a->data;
            sVar10 = c->cstep;
            sVar11 = c->elemsize;
            pvVar64 = c->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vmaxps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
              *(undefined1 (*) [64])((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
    }
LAB_003c7aa4:
    pOVar46 = (Option *)local_158->blob_allocator;
LAB_003c7aad:
    iVar39 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                       (a,local_150,c,pOVar46);
    return iVar39;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
    local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
    uVar62 = a->w;
    uVar40 = a->h;
    iVar43 = a->d;
    uVar56 = a->c;
    uVar41 = (ulong)uVar56;
    local_148 = CONCAT44(local_148._4_4_,uVar40 * uVar62 * iVar43);
    sVar7 = a->elemsize;
    uVar57 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar42 = (ulong)uVar3;
    iVar54 = uVar5 * uVar57 * iVar4;
    sVar8 = a[1].elemsize;
    local_128 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar39 != 1 || uVar62 != 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          pOVar46 = (Option *)local_158->blob_allocator;
          if ((int)local_140 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                      (a,local_150,c,pOVar46);
            return 0;
          }
          break;
        case 2:
          Mat::create(c,uVar57,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar44 = (undefined1 (*) [64])c->data;
          if (pauVar44 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])a->data;
          pauVar51 = (undefined1 (*) [64])a[1].data;
          uVar62 = 0;
          do {
            if (0 < (int)uVar57) {
              auVar71 = *pauVar47;
              uVar40 = uVar57;
              do {
                auVar70 = vminps_avx512f(auVar71,*pauVar51);
                *pauVar44 = auVar70;
                pauVar51 = pauVar51 + 1;
                pauVar44 = pauVar44 + 1;
                uVar40 = uVar40 - 1;
              } while (uVar40 != 0);
            }
            pauVar47 = pauVar47 + 1;
            uVar62 = uVar62 + 1;
          } while (uVar62 != uVar5);
          return 0;
        case 3:
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar70 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        case 4:
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar54) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + uVar41 * 0x40);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = iVar54;
              do {
                auVar70 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        default:
          goto LAB_003cade6;
        }
        goto LAB_003c7e04;
      }
      goto LAB_003bdb38;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a[1].cstep * uVar41 * a[1].elemsize + (long)a[1].data);
            pauVar51 = (undefined1 (*) [64])((long)a->w * uVar41 * a->elemsize + (long)a->data);
            uVar62 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *pauVar51;
                uVar40 = uVar57;
                do {
                  auVar70 = vminps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar40 = uVar40 - 1;
                } while (uVar40 != 0);
              }
              pauVar51 = pauVar51 + 1;
              uVar62 = uVar62 + 1;
            } while (uVar62 != uVar5);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      if (a[1].dims == 4) {
        local_130 = a;
        Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar41 = 0;
        do {
          if (0 < iVar4) {
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                       (long)local_130[1].data);
            pauVar51 = (undefined1 (*) [64])
                       ((long)local_130->w * uVar41 * local_130->elemsize + (long)local_130->data);
            iVar39 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar71 = *pauVar51;
                uVar62 = 0;
                do {
                  uVar40 = uVar57;
                  if (0 < (int)uVar57) {
                    do {
                      auVar70 = vminps_avx512f(auVar71,*pauVar47);
                      *pauVar44 = auVar70;
                      pauVar47 = pauVar47 + 1;
                      pauVar44 = pauVar44 + 1;
                      uVar40 = uVar40 - 1;
                    } while (uVar40 != 0);
                  }
                  uVar62 = uVar62 + 1;
                } while (uVar62 != uVar5);
              }
              pauVar51 = pauVar51 + 1;
              iVar39 = iVar39 + 1;
            } while (iVar39 != iVar4);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
        return 0;
      }
      local_130 = a;
      Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = local_130[1].dims;
      a = local_130;
      if (iVar39 == 1) {
        Mat::create(c,uVar62,uVar40,sVar7,(uint)local_138,local_158->blob_allocator);
        pauVar44 = (undefined1 (*) [64])c->data;
        if (pauVar44 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar40 < 1) {
            return 0;
          }
          pauVar47 = (undefined1 (*) [64])local_130->data;
          pauVar51 = (undefined1 (*) [64])local_130[1].data;
          uVar56 = 0;
          do {
            if (0 < (int)uVar62) {
              auVar71 = *pauVar51;
              uVar57 = uVar62;
              do {
                auVar70 = vminps_avx512f(auVar71,*pauVar47);
                *pauVar44 = auVar70;
                pauVar47 = pauVar47 + 1;
                pauVar44 = pauVar44 + 1;
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            pauVar51 = pauVar51 + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 != uVar40);
          return 0;
        }
        break;
      }
joined_r0x003c295f:
      if (iVar39 != 2) {
        return 0;
      }
      pOVar46 = (Option *)local_158->blob_allocator;
      local_130 = a;
LAB_003bf772:
      iVar39 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                         (a,local_150,c,pOVar46);
      return iVar39;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_130 = a;
          Mat::create(c,uVar57,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < iVar4) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar41 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (local_130[1].cstep * uVar41 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar41 * local_130->elemsize + (long)local_130->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar62 = 0;
                  do {
                    if (0 < (int)uVar57) {
                      auVar71 = *pauVar51;
                      uVar40 = uVar57;
                      do {
                        auVar70 = vminps_avx512f(auVar71,*pauVar47);
                        *pauVar44 = auVar70;
                        pauVar47 = pauVar47 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar40 = uVar40 - 1;
                      } while (uVar40 != 0);
                    }
                    pauVar51 = pauVar51 + 1;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar5);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar4);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        local_130 = a;
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if (local_130[1].dims != 1) {
          if (local_130[1].dims != 2) {
            return 0;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)uVar40) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)local_130[1].w * uVar42 * local_130[1].elemsize +
                         (long)local_130[1].data);
              pauVar51 = (undefined1 (*) [64])
                         (local_130->cstep * uVar42 * local_130->elemsize + (long)local_130->data);
              uVar56 = 0;
              do {
                if (0 < (int)uVar62) {
                  auVar71 = *pauVar47;
                  uVar57 = uVar62;
                  do {
                    auVar70 = vminps_avx512f(auVar71,*pauVar51);
                    *pauVar44 = auVar70;
                    pauVar51 = pauVar51 + 1;
                    pauVar44 = pauVar44 + 1;
                    uVar57 = uVar57 - 1;
                  } while (uVar57 != 0);
                }
                pauVar47 = pauVar47 + 1;
                uVar56 = uVar56 + 1;
              } while (uVar56 != uVar40);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        a = local_130;
        if ((int)local_140 != 1 || local_130[1].w != 1) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
              pvVar49 = c->data;
              sVar10 = local_130->cstep;
              sVar11 = local_130->elemsize;
              pvVar64 = local_130->data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        break;
      }
      local_118 = sVar8;
      if (uVar3 == uVar56 && ((uVar57 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = c->cstep;
            sVar8 = c->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)a[1].data + a[1].cstep * uVar42 * a[1].elemsize);
            pvVar49 = c->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar64 = a->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42))
              ;
              *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      local_120 = uVar42;
      if (uVar57 == uVar62) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar40)) {
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              sVar10 = a->cstep;
              pvVar49 = c->data;
              pvVar64 = a[1].data;
              sVar11 = a->elemsize;
              pvVar68 = a->data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                uVar1 = *(undefined4 *)((long)pvVar64 + lVar67 * 4);
                auVar71._4_4_ = uVar1;
                auVar71._0_4_ = uVar1;
                auVar71._8_4_ = uVar1;
                auVar71._12_4_ = uVar1;
                auVar71._16_4_ = uVar1;
                auVar71._20_4_ = uVar1;
                auVar71._24_4_ = uVar1;
                auVar71._28_4_ = uVar1;
                auVar71._32_4_ = uVar1;
                auVar71._36_4_ = uVar1;
                auVar71._40_4_ = uVar1;
                auVar71._44_4_ = uVar1;
                auVar71._48_4_ = uVar1;
                auVar71._52_4_ = uVar1;
                auVar71._56_4_ = uVar1;
                auVar71._60_4_ = uVar1;
                auVar71 = vminps_avx512f(*(undefined1 (*) [64])
                                          ((long)pvVar68 + lVar63 * 4 + sVar10 * sVar11 * uVar42),
                                         auVar71);
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 * 4 + sVar7 * sVar8 * uVar42) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        local_148 = CONCAT44(local_148._4_4_,iVar54);
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) {
LAB_003c6a65:
          local_148 = CONCAT44(local_148._4_4_,iVar54);
          Mat::create(c,uVar57,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              auVar71 = *(undefined1 (*) [64])((long)a->data + a->cstep * uVar41 * a->elemsize);
              pvVar49 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar64 = a[1].data;
              lVar63 = 0;
              iVar39 = (int)local_148;
              do {
                auVar70 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar41
                                                  ));
                *(undefined1 (*) [64])((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar41) = auVar70;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
        if (((iVar39 == 1) && (uVar5 == uVar40)) && (uVar56 == 1)) {
          Mat::create(c,uVar62,uVar40,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar41 = 0;
          do {
            if (0 < (int)local_148) {
              sVar7 = c->cstep;
              sVar8 = c->elemsize;
              pvVar49 = a->data;
              pvVar64 = c->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar68 = a[1].data;
              lVar63 = 0;
              lVar67 = 0;
              do {
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar49 + lVar67 * 4)));
                auVar71 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                  ((long)pvVar68 +
                                                  lVar63 * 4 + sVar10 * sVar11 * uVar41));
                *(undefined1 (*) [64])((long)pvVar64 + lVar63 * 4 + sVar7 * sVar8 * uVar41) =
                     auVar71;
                lVar67 = lVar67 + 1;
                lVar63 = lVar63 + 0x10;
              } while ((int)local_148 != (int)lVar67);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar42);
          return 0;
        }
      }
      else {
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((uVar62 == 1 && uVar40 == 1) && uVar3 == uVar56) goto LAB_003c6a65;
      }
      local_148 = CONCAT44(local_148._4_4_,iVar54);
      if ((((uVar57 ^ 1) == 0 && uVar5 == uVar40) && uVar56 == uVar3) && uVar62 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar49 = a[1].data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar62) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar56 = uVar62;
                do {
                  auVar70 = vminps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar56 = uVar56 - 1;
                } while (uVar56 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if (((uVar57 == uVar62 && (uVar5 ^ 1) == 0) && uVar56 == uVar3) && uVar40 != 1) {
        Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = a[1].elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(a->cstep * uVar42 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar49 = a[1].data;
            uVar56 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar68 + lVar63),
                                           *(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar56 = uVar56 + 1;
            } while (uVar56 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      if ((uVar3 == uVar56 && uVar5 == uVar40) && (uVar57 != 1 && uVar62 == 1)) {
        local_130 = a;
        Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar7 = local_130->cstep;
            sVar8 = local_130->elemsize;
            pvVar49 = local_130->data;
            pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pauVar47 = (undefined1 (*) [64])
                       (local_130[1].cstep * uVar42 * local_130[1].elemsize +
                       (long)local_130[1].data);
            uVar55 = 0;
            do {
              if (0 < (int)uVar57) {
                auVar71 = *(undefined1 (*) [64])
                           ((long)pvVar49 + uVar55 * 0x40 + sVar7 * uVar42 * sVar8);
                uVar62 = uVar57;
                do {
                  auVar70 = vminps_avx512f(auVar71,*pauVar47);
                  *pauVar44 = auVar70;
                  pauVar47 = pauVar47 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar40);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
      pOVar46 = (Option *)opt->blob_allocator;
      local_130 = a;
      if (((byte)local_10c & uVar3 == uVar56 & (uVar5 != 1 && uVar57 == uVar62)) == 1) {
        Mat::create(c,uVar62,uVar5,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_130->elemsize;
            pvVar64 = (void *)(c->cstep * uVar42 * c->elemsize + (long)c->data);
            pvVar68 = (void *)(local_130[1].cstep * uVar42 * local_130[1].elemsize +
                              (long)local_130[1].data);
            sVar8 = local_130->cstep;
            pvVar49 = local_130->data;
            uVar40 = 0;
            do {
              if (0 < (int)uVar62) {
                lVar63 = 0;
                do {
                  auVar71 = vminps_avx512f(*(undefined1 (*) [64])
                                            ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42),
                                           *(undefined1 (*) [64])((long)pvVar68 + lVar63));
                  *(undefined1 (*) [64])((long)pvVar64 + lVar63) = auVar71;
                  lVar63 = lVar63 + 0x40;
                } while ((ulong)uVar62 << 6 != lVar63);
                pvVar64 = (void *)((long)pvVar64 + lVar63);
                pvVar68 = (void *)((long)pvVar68 + lVar63);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != uVar5);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
LAB_003bf76a:
      local_140 = (__m512 *)CONCAT44(local_140._4_4_,_elempack);
      local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
      goto LAB_003bf772;
    case 4:
      pOVar46 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003bf76a;
      Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = a[1].dims;
      if (iVar39 != 1) {
        if (iVar39 == 3) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         (a[1].cstep * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      auVar71 = *pauVar47;
                      uVar57 = uVar62;
                      do {
                        auVar70 = vminps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    pauVar47 = pauVar47 + 1;
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        if (iVar39 == 2) {
          if ((int)uVar56 < 1) {
            return 0;
          }
          uVar42 = 0;
          do {
            if (0 < iVar43) {
              pauVar44 = (undefined1 (*) [64])(c->cstep * uVar42 * c->elemsize + (long)c->data);
              pauVar47 = (undefined1 (*) [64])
                         ((long)a[1].w * uVar42 * a[1].elemsize + (long)a[1].data);
              pauVar51 = (undefined1 (*) [64])(a->cstep * uVar42 * a->elemsize + (long)a->data);
              iVar39 = 0;
              do {
                if (0 < (int)uVar40) {
                  auVar71 = *pauVar47;
                  uVar56 = 0;
                  do {
                    uVar57 = uVar62;
                    if (0 < (int)uVar62) {
                      do {
                        auVar70 = vminps_avx512f(auVar71,*pauVar51);
                        *pauVar44 = auVar70;
                        pauVar51 = pauVar51 + 1;
                        pauVar44 = pauVar44 + 1;
                        uVar57 = uVar57 - 1;
                      } while (uVar57 != 0);
                    }
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar40);
                }
                pauVar47 = pauVar47 + 1;
                iVar39 = iVar39 + 1;
              } while (iVar39 != iVar43);
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar41);
          return 0;
        }
        return 0;
      }
      if ((int)local_140 != 1 || a[1].w != 1) {
        if ((int)uVar56 < 1) {
          return 0;
        }
        uVar42 = 0;
        do {
          if (0 < (int)local_148) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar71 = *(undefined1 (*) [64])((long)local_150->data + uVar42 * 0x40);
            pvVar49 = a->data;
            sVar10 = c->cstep;
            sVar11 = c->elemsize;
            pvVar64 = c->data;
            lVar63 = 0;
            iVar39 = (int)local_148;
            do {
              auVar70 = vminps_avx512f(auVar71,*(undefined1 (*) [64])
                                                ((long)pvVar49 + lVar63 + sVar7 * sVar8 * uVar42));
              *(undefined1 (*) [64])((long)pvVar64 + lVar63 + sVar10 * sVar11 * uVar42) = auVar70;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != uVar41);
        return 0;
      }
    }
LAB_003c7dfb:
    pOVar46 = (Option *)local_158->blob_allocator;
LAB_003c7e04:
    iVar39 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                       (a,local_150,c,pOVar46);
    return iVar39;
  case 6:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar62 = a->w;
    local_140 = (__m512 *)(ulong)uVar62;
    uVar40 = a->h;
    local_150 = (Mat *)(ulong)uVar40;
    iVar43 = a->d;
    uVar56 = a->c;
    local_120 = (ulong)uVar56;
    local_128 = CONCAT44(local_128._4_4_,uVar40 * uVar62 * iVar43);
    sVar7 = a->elemsize;
    uVar57 = a[1].w;
    local_138._0_4_ = a[1].h;
    iVar4 = a[1].d;
    uVar5 = a[1].c;
    local_118 = (ulong)uVar5;
    local_158 = (Option *)CONCAT44(local_158._4_4_,uVar57);
    local_148 = CONCAT44(local_148._4_4_,iVar4);
    local_10c = (uint)local_138 * uVar57 * iVar4;
    sVar8 = a[1].elemsize;
    local_108 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar39 != 1 || uVar62 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003bd8a0_caseD_1;
        case 2:
          local_130 = a;
          Mat::create(c,uVar57,(uint)local_138,sVar8,_elempack,opt->blob_allocator);
          puVar60 = (undefined8 *)c->data;
          if (puVar60 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)(uint)local_138 < 1) {
            return 0;
          }
          local_150 = (Mat *)local_130->data;
          pafVar58 = (__m512 *)local_130[1].data;
          local_140 = (__m512 *)((ulong)local_140 & 0xffffffff00000000);
          do {
            local_c0 = *(__m512 *)local_150;
            iVar39 = (uint)local_158;
            if (0 < (int)(uint)local_158) {
              do {
                uVar73 = *(undefined8 *)*pafVar58;
                uVar80 = *(undefined8 *)(*pafVar58 + 2);
                uVar81 = *(undefined8 *)(*pafVar58 + 4);
                uVar82 = *(undefined8 *)(*pafVar58 + 6);
                uVar83 = *(undefined8 *)(*pafVar58 + 8);
                uVar84 = *(undefined8 *)(*pafVar58 + 10);
                uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                local_100 = *pafVar58;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_159,&local_c0,&local_100);
                *puVar60 = uVar73;
                puVar60[1] = uVar80;
                puVar60[2] = uVar81;
                puVar60[3] = uVar82;
                puVar60[4] = uVar83;
                puVar60[5] = uVar84;
                puVar60[6] = uVar85;
                puVar60[7] = uVar86;
                pafVar58 = pafVar58 + 1;
                puVar60 = puVar60 + 8;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            local_150 = (Mat *)((long)local_150 + 0x40);
            uVar62 = (int)local_140 + 1;
            local_140 = (__m512 *)CONCAT44(local_140._4_4_,uVar62);
          } while (uVar62 != (uint)local_138);
          return 0;
        case 3:
          local_130 = a;
          Mat::create(c,uVar57,(uint)local_138,uVar5,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_118 < 1) {
            return 0;
          }
          local_150 = (Mat *)0x0;
          do {
            local_c0 = *(__m512 *)((long)local_130->data + (long)local_150 * 0x40);
            if (0 < (int)local_10c) {
              local_158 = (Option *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
              local_138 = (__m512 *)
                          (local_130[1].cstep * local_130[1].elemsize * (long)local_150 +
                          (long)local_130[1].data);
              lVar63 = 0;
              uVar62 = local_10c;
              do {
                pafVar58 = (__m512 *)((long)local_138 + lVar63);
                uVar73 = *(undefined8 *)*pafVar58;
                uVar80 = *(undefined8 *)(*pafVar58 + 2);
                uVar81 = *(undefined8 *)(*pafVar58 + 4);
                uVar82 = *(undefined8 *)(*pafVar58 + 6);
                uVar83 = *(undefined8 *)(*pafVar58 + 8);
                uVar84 = *(undefined8 *)(*pafVar58 + 10);
                uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                local_100 = *pafVar58;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_159,&local_c0,&local_100);
                puVar60 = (undefined8 *)((long)local_158 + lVar63);
                *puVar60 = uVar73;
                puVar60[1] = uVar80;
                puVar60[2] = uVar81;
                puVar60[3] = uVar82;
                puVar60[4] = uVar83;
                puVar60[5] = uVar84;
                puVar60[6] = uVar85;
                puVar60[7] = uVar86;
                lVar63 = lVar63 + 0x40;
                uVar62 = uVar62 - 1;
              } while (uVar62 != 0);
            }
            local_150 = (Mat *)((long)local_150 + 1);
          } while (local_150 != (Mat *)local_118);
          return 0;
        case 4:
          local_130 = a;
          Mat::create(c,uVar57,(uint)local_138,iVar4,uVar5,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_118 < 1) {
            return 0;
          }
          local_150 = (Mat *)0x0;
          do {
            local_c0 = *(__m512 *)((long)local_130->data + (long)local_150 * 0x40);
            if (0 < (int)local_10c) {
              local_158 = (Option *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
              local_138 = (__m512 *)
                          (local_130[1].cstep * local_130[1].elemsize * (long)local_150 +
                          (long)local_130[1].data);
              lVar63 = 0;
              uVar62 = local_10c;
              do {
                pafVar58 = (__m512 *)((long)local_138 + lVar63);
                uVar73 = *(undefined8 *)*pafVar58;
                uVar80 = *(undefined8 *)(*pafVar58 + 2);
                uVar81 = *(undefined8 *)(*pafVar58 + 4);
                uVar82 = *(undefined8 *)(*pafVar58 + 6);
                uVar83 = *(undefined8 *)(*pafVar58 + 8);
                uVar84 = *(undefined8 *)(*pafVar58 + 10);
                uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                local_100 = *pafVar58;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_159,&local_c0,&local_100);
                puVar60 = (undefined8 *)((long)local_158 + lVar63);
                *puVar60 = uVar73;
                puVar60[1] = uVar80;
                puVar60[2] = uVar81;
                puVar60[3] = uVar82;
                puVar60[4] = uVar83;
                puVar60[5] = uVar84;
                puVar60[6] = uVar85;
                puVar60[7] = uVar86;
                lVar63 = lVar63 + 0x40;
                uVar62 = uVar62 - 1;
              } while (uVar62 != 0);
            }
            local_150 = (Mat *)((long)local_150 + 1);
          } while (local_150 != (Mat *)local_118);
          return 0;
        default:
          return 0;
        }
      }
      goto LAB_003bdbf1;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        local_130 = a;
        Mat::create(c,uVar57,(uint)local_138,uVar5,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)local_118 < 1) {
          return 0;
        }
        local_148 = 0;
        uVar62 = (uint)local_138;
        do {
          if (0 < (int)uVar62) {
            puVar60 = (undefined8 *)(c->cstep * local_148 * c->elemsize + (long)c->data);
            pafVar58 = (__m512 *)
                       (local_130[1].cstep * local_148 * local_130[1].elemsize +
                       (long)local_130[1].data);
            local_150 = (Mat *)((long)local_130->w * local_148 * local_130->elemsize +
                               (long)local_130->data);
            uVar40 = 0;
            do {
              local_140 = (__m512 *)CONCAT44(local_140._4_4_,uVar40);
              local_c0 = *(__m512 *)local_150;
              iVar39 = (uint)local_158;
              if (0 < (int)(uint)local_158) {
                do {
                  uVar73 = *(undefined8 *)*pafVar58;
                  uVar80 = *(undefined8 *)(*pafVar58 + 2);
                  uVar81 = *(undefined8 *)(*pafVar58 + 4);
                  uVar82 = *(undefined8 *)(*pafVar58 + 6);
                  uVar83 = *(undefined8 *)(*pafVar58 + 8);
                  uVar84 = *(undefined8 *)(*pafVar58 + 10);
                  uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                  uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                  local_100 = *pafVar58;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_159,&local_c0,&local_100);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  puVar60[4] = uVar83;
                  puVar60[5] = uVar84;
                  puVar60[6] = uVar85;
                  puVar60[7] = uVar86;
                  pafVar58 = pafVar58 + 1;
                  puVar60 = puVar60 + 8;
                  iVar39 = iVar39 + -1;
                } while (iVar39 != 0);
              }
              local_150 = (Mat *)((long)local_150 + 0x40);
              uVar40 = (int)local_140 + 1;
              uVar62 = (uint)local_138;
            } while (uVar40 != (uint)local_138);
          }
          local_148 = local_148 + 1;
        } while (local_148 != local_118);
        return 0;
      }
      if (a[1].dims == 4) {
        local_130 = a;
        Mat::create(c,uVar57,(uint)local_138,iVar4,uVar5,sVar8,_elempack,pAVar9);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)local_118 < 1) {
          return 0;
        }
        local_120 = 0;
        uVar62 = (uint)local_138;
        do {
          if (0 < (int)local_148) {
            puVar60 = (undefined8 *)(c->cstep * local_120 * c->elemsize + (long)c->data);
            pafVar58 = (__m512 *)
                       (local_130[1].cstep * local_120 * local_130[1].elemsize +
                       (long)local_130[1].data);
            local_140 = (__m512 *)
                        ((long)local_130->w * local_120 * local_130->elemsize +
                        (long)local_130->data);
            iVar39 = 0;
            do {
              local_128 = CONCAT44(local_128._4_4_,iVar39);
              local_c0 = *local_140;
              if (0 < (int)uVar62) {
                uVar40 = 0;
                do {
                  local_150 = (Mat *)CONCAT44(local_150._4_4_,uVar40);
                  iVar39 = (uint)local_158;
                  if (0 < (int)(uint)local_158) {
                    do {
                      uVar73 = *(undefined8 *)*pafVar58;
                      uVar80 = *(undefined8 *)(*pafVar58 + 2);
                      uVar81 = *(undefined8 *)(*pafVar58 + 4);
                      uVar82 = *(undefined8 *)(*pafVar58 + 6);
                      uVar83 = *(undefined8 *)(*pafVar58 + 8);
                      uVar84 = *(undefined8 *)(*pafVar58 + 10);
                      uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                      uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                      local_100 = *pafVar58;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_159,&local_c0,&local_100);
                      *puVar60 = uVar73;
                      puVar60[1] = uVar80;
                      puVar60[2] = uVar81;
                      puVar60[3] = uVar82;
                      puVar60[4] = uVar83;
                      puVar60[5] = uVar84;
                      puVar60[6] = uVar85;
                      puVar60[7] = uVar86;
                      pafVar58 = pafVar58 + 1;
                      puVar60 = puVar60 + 8;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar40 = (int)local_150 + 1;
                  uVar62 = (uint)local_138;
                } while (uVar40 != (uint)local_138);
              }
              local_140 = local_140 + 1;
              iVar39 = (int)local_128 + 1;
            } while (iVar39 != (int)local_148);
          }
          local_120 = local_120 + 1;
        } while (local_120 != local_118);
        return 0;
      }
      local_130 = a;
      Mat::create(c,uVar62,uVar40,sVar7,iVar39,pAVar9);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      if (local_130[1].dims != 1) {
        if (local_130[1].dims != 2) {
          return 0;
        }
        pOVar46 = (Option *)opt->blob_allocator;
        a = local_130;
LAB_003beafa:
        iVar39 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                           (a,pMVar48,c,pOVar46);
        return iVar39;
      }
      Mat::create(c,(int)local_140,(int)local_150,sVar7,iVar39,opt->blob_allocator);
      puVar60 = (undefined8 *)c->data;
      if (puVar60 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || local_130[1].w != 1) {
        if ((int)local_150 < 1) {
          return 0;
        }
        pafVar58 = (__m512 *)local_130->data;
        local_158 = (Option *)local_130[1].data;
        local_138 = (__m512 *)((ulong)local_138._4_4_ << 0x20);
        do {
          local_c0 = *(__m512 *)local_158;
          uVar41 = (ulong)local_140 & 0xffffffff;
          if (0 < (int)local_140) {
            do {
              uVar73 = *(undefined8 *)*pafVar58;
              uVar80 = *(undefined8 *)(*pafVar58 + 2);
              uVar81 = *(undefined8 *)(*pafVar58 + 4);
              uVar82 = *(undefined8 *)(*pafVar58 + 6);
              uVar83 = *(undefined8 *)(*pafVar58 + 8);
              uVar84 = *(undefined8 *)(*pafVar58 + 10);
              uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
              uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
              local_100 = *pafVar58;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_159,&local_100,&local_c0);
              *puVar60 = uVar73;
              puVar60[1] = uVar80;
              puVar60[2] = uVar81;
              puVar60[3] = uVar82;
              puVar60[4] = uVar83;
              puVar60[5] = uVar84;
              puVar60[6] = uVar85;
              puVar60[7] = uVar86;
              pafVar58 = pafVar58 + 1;
              puVar60 = puVar60 + 8;
              uVar62 = (int)uVar41 - 1;
              uVar41 = (ulong)uVar62;
            } while (uVar62 != 0);
          }
          local_158 = local_158 + 1;
          iVar39 = (uint)local_138 + 1;
          local_138 = (__m512 *)CONCAT44(local_138._4_4_,iVar39);
        } while (iVar39 != (int)local_150);
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        local_7c = (uint)local_138 ^ 1;
        local_148 = CONCAT44(local_148._4_4_,uVar57) ^ 1;
        if (uVar5 == uVar56 && (uVar57 == 1 && local_7c == 0)) {
          local_130 = a;
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_120 < 1) {
            return 0;
          }
          local_150 = (Mat *)0x0;
          do {
            local_c0 = *(__m512 *)
                        ((long)local_130[1].data +
                        local_130[1].cstep * (long)local_150 * local_130[1].elemsize);
            if (0 < (int)local_128) {
              local_138 = (__m512 *)((long)c->data + c->cstep * c->elemsize * (long)local_150);
              local_158 = (Option *)
                          ((long)local_130->data +
                          local_130->cstep * local_130->elemsize * (long)local_150);
              lVar63 = 0;
              iVar39 = (int)local_128;
              do {
                pafVar58 = (__m512 *)((long)local_158 + lVar63);
                uVar73 = *(undefined8 *)*pafVar58;
                uVar80 = *(undefined8 *)(*pafVar58 + 2);
                uVar81 = *(undefined8 *)(*pafVar58 + 4);
                uVar82 = *(undefined8 *)(*pafVar58 + 6);
                uVar83 = *(undefined8 *)(*pafVar58 + 8);
                uVar84 = *(undefined8 *)(*pafVar58 + 10);
                uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                local_100 = *pafVar58;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_159,&local_100,&local_c0);
                puVar60 = (undefined8 *)((long)local_138 + lVar63);
                *puVar60 = uVar73;
                puVar60[1] = uVar80;
                puVar60[2] = uVar81;
                puVar60[3] = uVar82;
                puVar60[4] = uVar83;
                puVar60[5] = uVar84;
                puVar60[6] = uVar85;
                puVar60[7] = uVar86;
                lVar63 = lVar63 + 0x40;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            local_150 = (Mat *)((long)local_150 + 1);
          } while (local_150 != (Mat *)local_120);
          return 0;
        }
        if (uVar57 == uVar62) {
          if (_elempack == 1 && (uVar5 == 1 && (uint)local_138 == uVar40)) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_120 < 1) {
              return 0;
            }
            local_140 = (__m512 *)(local_128 & 0xffffffff);
            local_148 = 0;
            do {
              if (0 < (int)local_128) {
                local_158 = (Option *)(c->cstep * c->elemsize * local_148 + (long)c->data);
                local_150 = (Mat *)local_130[1].data;
                local_138 = (__m512 *)
                            (local_130->cstep * local_130->elemsize * local_148 +
                            (long)local_130->data);
                lVar67 = 0;
                lVar63 = 0;
                do {
                  local_c0 = *(__m512 *)((long)local_138 + lVar67 * 4);
                  afVar72 = (__m512)vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)((long)local_150 + lVar63 * 4)));
                  local_100 = afVar72;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_159,&local_c0,&local_100);
                  *(__m512 *)((long)local_158 + lVar67 * 4) = afVar72;
                  lVar63 = lVar63 + 1;
                  lVar67 = lVar67 + 0x10;
                } while ((int)local_140 != (int)lVar63);
              }
              local_148 = local_148 + 1;
            } while (local_148 != local_120);
            return 0;
          }
          local_128 = CONCAT71(local_128._1_7_,uVar62 == 1);
          if ((uVar62 == 1 && uVar40 == 1) && uVar5 == uVar56) {
LAB_003c6b67:
            local_130 = a;
            Mat::create(c,uVar57,(uint)local_138,uVar5,sVar8,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_118 < 1) {
              return 0;
            }
            local_150 = (Mat *)0x0;
            do {
              local_c0 = *(__m512 *)
                          ((long)local_130->data +
                          local_130->cstep * (long)local_150 * local_130->elemsize);
              if (0 < (int)local_10c) {
                local_138 = (__m512 *)((long)c->data + c->cstep * c->elemsize * (long)local_150);
                local_158 = (Option *)
                            ((long)local_130[1].data +
                            local_130[1].cstep * local_130[1].elemsize * (long)local_150);
                lVar63 = 0;
                uVar62 = local_10c;
                do {
                  pafVar58 = (__m512 *)((long)local_158 + lVar63);
                  uVar73 = *(undefined8 *)*pafVar58;
                  uVar80 = *(undefined8 *)(*pafVar58 + 2);
                  uVar81 = *(undefined8 *)(*pafVar58 + 4);
                  uVar82 = *(undefined8 *)(*pafVar58 + 6);
                  uVar83 = *(undefined8 *)(*pafVar58 + 8);
                  uVar84 = *(undefined8 *)(*pafVar58 + 10);
                  uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                  uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                  local_100 = *pafVar58;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_159,&local_c0,&local_100);
                  puVar60 = (undefined8 *)((long)local_138 + lVar63);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  puVar60[4] = uVar83;
                  puVar60[5] = uVar84;
                  puVar60[6] = uVar85;
                  puVar60[7] = uVar86;
                  lVar63 = lVar63 + 0x40;
                  uVar62 = uVar62 - 1;
                } while (uVar62 != 0);
              }
              local_150 = (Mat *)((long)local_150 + 1);
            } while (local_150 != (Mat *)local_118);
            return 0;
          }
          if (((iVar39 == 1) && ((uint)local_138 == uVar40)) && (uVar56 == 1)) {
            local_130 = a;
            Mat::create(c,uVar62,uVar40,uVar5,sVar8,_elempack,opt->blob_allocator);
            if (c->data == (void *)0x0) {
              return -100;
            }
            if ((long)c->c * c->cstep == 0) {
              return -100;
            }
            if ((int)local_118 < 1) {
              return 0;
            }
            local_140 = (__m512 *)(ulong)local_10c;
            local_148 = 0;
            do {
              if (0 < (int)local_10c) {
                local_138 = (__m512 *)local_130->data;
                local_158 = (Option *)(c->cstep * c->elemsize * local_148 + (long)c->data);
                local_150 = (Mat *)(local_130[1].cstep * local_130[1].elemsize * local_148 +
                                   (long)local_130[1].data);
                lVar67 = 0;
                lVar63 = 0;
                do {
                  local_c0 = (__m512)vbroadcastss_avx512f
                                               (ZEXT416(*(uint *)((long)local_138 + lVar63 * 4)));
                  pafVar58 = (__m512 *)((long)local_150 + lVar67 * 4);
                  uVar73 = *(undefined8 *)*pafVar58;
                  uVar80 = *(undefined8 *)(*pafVar58 + 2);
                  uVar81 = *(undefined8 *)(*pafVar58 + 4);
                  uVar82 = *(undefined8 *)(*pafVar58 + 6);
                  uVar83 = *(undefined8 *)(*pafVar58 + 8);
                  uVar84 = *(undefined8 *)(*pafVar58 + 10);
                  uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                  uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                  local_100 = *pafVar58;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_159,&local_c0,&local_100);
                  puVar60 = (undefined8 *)((long)local_158 + lVar67 * 4);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  puVar60[4] = uVar83;
                  puVar60[5] = uVar84;
                  puVar60[6] = uVar85;
                  puVar60[7] = uVar86;
                  lVar63 = lVar63 + 1;
                  lVar67 = lVar67 + 0x10;
                } while ((int)local_140 != (int)lVar63);
              }
              local_148 = local_148 + 1;
            } while (local_148 != local_118);
            return 0;
          }
        }
        else {
          local_128 = CONCAT71(local_128._1_7_,uVar62 == 1);
          if ((uVar62 == 1 && uVar40 == 1) && uVar5 == uVar56) goto LAB_003c6b67;
        }
        local_10c._1_3_ = (undefined3)(local_10c >> 8);
        local_10c = CONCAT31(local_10c._1_3_,uVar40 == 1);
        if ((((int)local_148 == 0 && (uint)local_138 == uVar40) && uVar56 == uVar5) && uVar62 != 1)
        {
          local_130 = a;
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_120 < 1) {
            return 0;
          }
          local_148 = 0;
          do {
            if (0 < (int)local_150) {
              local_138 = (__m512 *)
                          (local_130[1].cstep * local_148 * local_130[1].elemsize +
                          (long)local_130[1].data);
              puVar60 = (undefined8 *)(c->cstep * local_148 * c->elemsize + (long)c->data);
              pafVar58 = (__m512 *)
                         (local_130->cstep * local_148 * local_130->elemsize + (long)local_130->data
                         );
              local_158 = (Option *)0x0;
              do {
                local_c0 = *(__m512 *)((long)local_138 + (long)local_158 * 0x40);
                uVar41 = (ulong)local_140 & 0xffffffff;
                if (0 < (int)local_140) {
                  do {
                    uVar73 = *(undefined8 *)*pafVar58;
                    uVar80 = *(undefined8 *)(*pafVar58 + 2);
                    uVar81 = *(undefined8 *)(*pafVar58 + 4);
                    uVar82 = *(undefined8 *)(*pafVar58 + 6);
                    uVar83 = *(undefined8 *)(*pafVar58 + 8);
                    uVar84 = *(undefined8 *)(*pafVar58 + 10);
                    uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                    uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                    local_100 = *pafVar58;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_159,&local_100,&local_c0);
                    *puVar60 = uVar73;
                    puVar60[1] = uVar80;
                    puVar60[2] = uVar81;
                    puVar60[3] = uVar82;
                    puVar60[4] = uVar83;
                    puVar60[5] = uVar84;
                    puVar60[6] = uVar85;
                    puVar60[7] = uVar86;
                    pafVar58 = pafVar58 + 1;
                    puVar60 = puVar60 + 8;
                    uVar62 = (int)uVar41 - 1;
                    uVar41 = (ulong)uVar62;
                  } while (uVar62 != 0);
                }
                local_158 = (Option *)((long)local_158 + 1);
              } while ((Mat *)local_158 != local_150);
            }
            local_148 = local_148 + 1;
          } while (local_148 != local_120);
          return 0;
        }
        if (((uVar57 == uVar62 && local_7c == 0) && uVar56 == uVar5) && uVar40 != 1) {
          local_130 = a;
          Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_120 < 1) {
            return 0;
          }
          lVar63 = (long)local_140 << 6;
          local_148 = 0;
          local_138 = (__m512 *)lVar63;
          do {
            if (0 < (int)local_150) {
              pvVar68 = (void *)(c->cstep * local_148 * c->elemsize + (long)c->data);
              pvVar64 = (void *)(local_130->cstep * local_148 * local_130->elemsize +
                                (long)local_130->data);
              lVar67 = local_130[1].elemsize * local_130[1].cstep * local_148;
              pvVar49 = local_130[1].data;
              iVar39 = 0;
              pafVar58 = local_140;
              pMVar48 = local_150;
              do {
                if (0 < (int)pafVar58) {
                  local_158 = (Option *)CONCAT44(local_158._4_4_,iVar39);
                  lVar59 = 0;
                  do {
                    local_c0 = *(__m512 *)((long)pvVar64 + lVar59);
                    pafVar58 = (__m512 *)((long)pvVar49 + lVar59 + lVar67);
                    uVar73 = *(undefined8 *)*pafVar58;
                    uVar80 = *(undefined8 *)(*pafVar58 + 2);
                    uVar81 = *(undefined8 *)(*pafVar58 + 4);
                    uVar82 = *(undefined8 *)(*pafVar58 + 6);
                    uVar83 = *(undefined8 *)(*pafVar58 + 8);
                    uVar84 = *(undefined8 *)(*pafVar58 + 10);
                    uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                    uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                    local_100 = *pafVar58;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_159,&local_c0,&local_100);
                    puVar60 = (undefined8 *)((long)pvVar68 + lVar59);
                    *puVar60 = uVar73;
                    puVar60[1] = uVar80;
                    puVar60[2] = uVar81;
                    puVar60[3] = uVar82;
                    puVar60[4] = uVar83;
                    puVar60[5] = uVar84;
                    puVar60[6] = uVar85;
                    puVar60[7] = uVar86;
                    lVar59 = lVar59 + 0x40;
                  } while (lVar63 != lVar59);
                  pvVar68 = (void *)((long)pvVar68 + lVar59);
                  pvVar64 = (void *)((long)pvVar64 + lVar59);
                  pafVar58 = local_140;
                  pMVar48 = local_150;
                  iVar39 = (uint)local_158;
                }
                iVar39 = iVar39 + 1;
              } while (iVar39 != (int)pMVar48);
            }
            local_148 = local_148 + 1;
          } while (local_148 != local_120);
          return 0;
        }
        if (((uVar5 == uVar56 && (uint)local_138 == uVar40) & uVar57 != 1 & (byte)local_128) == 1) {
          local_130 = a;
          Mat::create(c,uVar57,uVar40,uVar56,sVar8,_elempack,opt->blob_allocator);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_120 < 1) {
            return 0;
          }
          local_148 = 0;
          do {
            if (0 < (int)local_150) {
              local_140 = (__m512 *)
                          (local_130->cstep * local_148 * local_130->elemsize +
                          (long)local_130->data);
              puVar60 = (undefined8 *)(c->cstep * local_148 * c->elemsize + (long)c->data);
              pafVar58 = (__m512 *)
                         (local_130[1].cstep * local_148 * local_130[1].elemsize +
                         (long)local_130[1].data);
              local_138 = (__m512 *)0x0;
              do {
                local_c0 = *(__m512 *)((long)local_140 + (long)local_138 * 0x40);
                iVar39 = (uint)local_158;
                if (0 < (int)(uint)local_158) {
                  do {
                    uVar73 = *(undefined8 *)*pafVar58;
                    uVar80 = *(undefined8 *)(*pafVar58 + 2);
                    uVar81 = *(undefined8 *)(*pafVar58 + 4);
                    uVar82 = *(undefined8 *)(*pafVar58 + 6);
                    uVar83 = *(undefined8 *)(*pafVar58 + 8);
                    uVar84 = *(undefined8 *)(*pafVar58 + 10);
                    uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                    uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                    local_100 = *pafVar58;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_159,&local_c0,&local_100);
                    *puVar60 = uVar73;
                    puVar60[1] = uVar80;
                    puVar60[2] = uVar81;
                    puVar60[3] = uVar82;
                    puVar60[4] = uVar83;
                    puVar60[5] = uVar84;
                    puVar60[6] = uVar85;
                    puVar60[7] = uVar86;
                    pafVar58 = pafVar58 + 1;
                    puVar60 = puVar60 + 8;
                    iVar39 = iVar39 + -1;
                  } while (iVar39 != 0);
                }
                local_138 = (__m512 *)((long)local_138 + 1);
              } while ((Mat *)local_138 != local_150);
            }
            local_148 = local_148 + 1;
          } while (local_148 != local_120);
          return 0;
        }
        pOVar46 = (Option *)opt->blob_allocator;
        local_130 = a;
        if ((uVar40 == 1 && uVar5 == uVar56) && ((uint)local_138 != 1 && uVar57 == uVar62)) {
          Mat::create(c,uVar62,(uint)local_138,uVar56,sVar8,_elempack,(Allocator *)pOVar46);
          if (c->data == (void *)0x0) {
            return -100;
          }
          if ((long)c->c * c->cstep == 0) {
            return -100;
          }
          if ((int)local_120 < 1) {
            return 0;
          }
          lVar63 = (long)local_140 << 6;
          local_148 = 0;
          uVar62 = (uint)local_138;
          local_150 = (Mat *)lVar63;
          do {
            uVar41 = local_120;
            if (0 < (int)uVar62) {
              pvVar68 = (void *)(c->cstep * local_148 * c->elemsize + (long)c->data);
              pvVar64 = (void *)(local_130[1].cstep * local_148 * local_130[1].elemsize +
                                (long)local_130[1].data);
              lVar67 = local_130->elemsize * local_130->cstep * local_148;
              pvVar49 = local_130->data;
              uVar40 = 0;
              pafVar58 = local_140;
              do {
                if (0 < (int)pafVar58) {
                  local_158 = (Option *)CONCAT44(local_158._4_4_,uVar40);
                  lVar59 = 0;
                  do {
                    local_c0 = *(__m512 *)((long)pvVar49 + lVar59 + lVar67);
                    pafVar58 = (__m512 *)((long)pvVar64 + lVar59);
                    uVar73 = *(undefined8 *)*pafVar58;
                    uVar80 = *(undefined8 *)(*pafVar58 + 2);
                    uVar81 = *(undefined8 *)(*pafVar58 + 4);
                    uVar82 = *(undefined8 *)(*pafVar58 + 6);
                    uVar83 = *(undefined8 *)(*pafVar58 + 8);
                    uVar84 = *(undefined8 *)(*pafVar58 + 10);
                    uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                    uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                    local_100 = *pafVar58;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_159,&local_c0,&local_100);
                    puVar60 = (undefined8 *)((long)pvVar68 + lVar59);
                    *puVar60 = uVar73;
                    puVar60[1] = uVar80;
                    puVar60[2] = uVar81;
                    puVar60[3] = uVar82;
                    puVar60[4] = uVar83;
                    puVar60[5] = uVar84;
                    puVar60[6] = uVar85;
                    puVar60[7] = uVar86;
                    lVar59 = lVar59 + 0x40;
                  } while (lVar63 != lVar59);
                  pvVar68 = (void *)((long)pvVar68 + lVar59);
                  pvVar64 = (void *)((long)pvVar64 + lVar59);
                  uVar41 = local_120;
                  pafVar58 = local_140;
                  uVar62 = (uint)local_138;
                  uVar40 = (uint)local_158;
                }
                uVar40 = uVar40 + 1;
              } while (uVar40 != uVar62);
            }
            local_148 = local_148 + 1;
          } while (local_148 != uVar41);
          return 0;
        }
        goto LAB_003beafa;
      }
      if (a[1].dims == 4) {
        local_130 = a;
        Mat::create(c,uVar57,(uint)local_138,iVar4,uVar5,sVar8,_elempack,opt->blob_allocator);
        if (c->data == (void *)0x0) {
          return -100;
        }
        if ((long)c->c * c->cstep == 0) {
          return -100;
        }
        if ((int)local_118 < 1) {
          return 0;
        }
        local_120 = 0;
        uVar62 = (uint)local_138;
        do {
          if (0 < (int)local_148) {
            puVar60 = (undefined8 *)(c->cstep * local_120 * c->elemsize + (long)c->data);
            pafVar58 = (__m512 *)
                       (local_130[1].cstep * local_120 * local_130[1].elemsize +
                       (long)local_130[1].data);
            local_150 = (Mat *)(local_130->cstep * local_120 * local_130->elemsize +
                               (long)local_130->data);
            iVar39 = 0;
            do {
              local_128 = CONCAT44(local_128._4_4_,iVar39);
              if (0 < (int)uVar62) {
                uVar40 = 0;
                do {
                  local_140 = (__m512 *)CONCAT44(local_140._4_4_,uVar40);
                  local_c0 = *(__m512 *)local_150;
                  iVar39 = (uint)local_158;
                  if (0 < (int)(uint)local_158) {
                    do {
                      uVar73 = *(undefined8 *)*pafVar58;
                      uVar80 = *(undefined8 *)(*pafVar58 + 2);
                      uVar81 = *(undefined8 *)(*pafVar58 + 4);
                      uVar82 = *(undefined8 *)(*pafVar58 + 6);
                      uVar83 = *(undefined8 *)(*pafVar58 + 8);
                      uVar84 = *(undefined8 *)(*pafVar58 + 10);
                      uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                      uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                      local_100 = *pafVar58;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_159,&local_c0,&local_100);
                      *puVar60 = uVar73;
                      puVar60[1] = uVar80;
                      puVar60[2] = uVar81;
                      puVar60[3] = uVar82;
                      puVar60[4] = uVar83;
                      puVar60[5] = uVar84;
                      puVar60[6] = uVar85;
                      puVar60[7] = uVar86;
                      pafVar58 = pafVar58 + 1;
                      puVar60 = puVar60 + 8;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  local_150 = (Mat *)((long)local_150 + 0x40);
                  uVar40 = (int)local_140 + 1;
                  uVar62 = (uint)local_138;
                } while (uVar40 != (uint)local_138);
              }
              iVar39 = (int)local_128 + 1;
            } while (iVar39 != (int)local_148);
          }
          local_120 = local_120 + 1;
        } while (local_120 != local_118);
        return 0;
      }
      local_130 = a;
      Mat::create(c,uVar62,uVar40,uVar56,sVar7,iVar39,opt->blob_allocator);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      if (local_130[1].dims != 1) {
        if (local_130[1].dims != 2) {
          return 0;
        }
        if ((int)local_120 < 1) {
          return 0;
        }
        local_148 = 0;
        do {
          if (0 < (int)local_150) {
            puVar60 = (undefined8 *)(c->cstep * local_148 * c->elemsize + (long)c->data);
            local_158 = (Option *)
                        ((long)local_130[1].w * local_148 * local_130[1].elemsize +
                        (long)local_130[1].data);
            pafVar58 = (__m512 *)
                       (local_130->cstep * local_148 * local_130->elemsize + (long)local_130->data);
            local_138._0_4_ = 0;
            do {
              local_c0 = *(__m512 *)local_158;
              uVar41 = (ulong)local_140 & 0xffffffff;
              if (0 < (int)local_140) {
                do {
                  uVar73 = *(undefined8 *)*pafVar58;
                  uVar80 = *(undefined8 *)(*pafVar58 + 2);
                  uVar81 = *(undefined8 *)(*pafVar58 + 4);
                  uVar82 = *(undefined8 *)(*pafVar58 + 6);
                  uVar83 = *(undefined8 *)(*pafVar58 + 8);
                  uVar84 = *(undefined8 *)(*pafVar58 + 10);
                  uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
                  uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
                  local_100 = *pafVar58;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_159,&local_100,&local_c0);
                  *puVar60 = uVar73;
                  puVar60[1] = uVar80;
                  puVar60[2] = uVar81;
                  puVar60[3] = uVar82;
                  puVar60[4] = uVar83;
                  puVar60[5] = uVar84;
                  puVar60[6] = uVar85;
                  puVar60[7] = uVar86;
                  pafVar58 = pafVar58 + 1;
                  puVar60 = puVar60 + 8;
                  uVar62 = (int)uVar41 - 1;
                  uVar41 = (ulong)uVar62;
                } while (uVar62 != 0);
              }
              local_158 = local_158 + 1;
              local_138._0_4_ = (uint)local_138 + 1;
            } while ((uint)local_138 != (int)local_150);
          }
          local_148 = local_148 + 1;
        } while (local_148 != local_120);
        return 0;
      }
      if (_elempack != 1 || local_130[1].w != 1) {
        if ((int)local_120 < 1) {
          return 0;
        }
        local_150 = (Mat *)0x0;
        do {
          local_c0 = *(__m512 *)((long)local_130[1].data + (long)local_150 * 0x40);
          if (0 < (int)local_128) {
            local_138 = (__m512 *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
            local_158 = (Option *)
                        ((long)local_130->data +
                        local_130->cstep * local_130->elemsize * (long)local_150);
            lVar63 = 0;
            iVar39 = (int)local_128;
            do {
              pafVar58 = (__m512 *)((long)local_158 + lVar63);
              uVar73 = *(undefined8 *)*pafVar58;
              uVar80 = *(undefined8 *)(*pafVar58 + 2);
              uVar81 = *(undefined8 *)(*pafVar58 + 4);
              uVar82 = *(undefined8 *)(*pafVar58 + 6);
              uVar83 = *(undefined8 *)(*pafVar58 + 8);
              uVar84 = *(undefined8 *)(*pafVar58 + 10);
              uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
              uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
              local_100 = *pafVar58;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_159,&local_100,&local_c0);
              puVar60 = (undefined8 *)((long)local_138 + lVar63);
              *puVar60 = uVar73;
              puVar60[1] = uVar80;
              puVar60[2] = uVar81;
              puVar60[3] = uVar82;
              puVar60[4] = uVar83;
              puVar60[5] = uVar84;
              puVar60[6] = uVar85;
              puVar60[7] = uVar86;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          local_150 = (Mat *)((long)local_150 + 1);
        } while (local_150 != (Mat *)local_120);
        return 0;
      }
      break;
    case 4:
      local_148 = CONCAT44(local_148._4_4_,iVar43);
      pOVar46 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003beafa;
      local_130 = a;
      Mat::create(c,uVar62,uVar40,iVar43,uVar56,sVar7,iVar39,(Allocator *)pOVar46);
      if (c->data == (void *)0x0) {
        return -100;
      }
      if ((long)c->c * c->cstep == 0) {
        return -100;
      }
      iVar39 = local_130[1].dims;
      iVar43 = (int)local_120;
      if (iVar39 != 1) {
        if (iVar39 == 3) {
          if (iVar43 < 1) {
            return 0;
          }
          local_118 = 0;
          do {
            if (0 < (int)local_148) {
              puVar60 = (undefined8 *)(c->cstep * local_118 * c->elemsize + (long)c->data);
              local_158 = (Option *)
                          (local_130[1].cstep * local_118 * local_130[1].elemsize +
                          (long)local_130[1].data);
              pafVar65 = (__m512 *)
                         (local_130->cstep * local_118 * local_130->elemsize + (long)local_130->data
                         );
              iVar39 = 0;
              pafVar58 = local_140;
              pMVar48 = local_150;
              do {
                local_128 = CONCAT44(local_128._4_4_,iVar39);
                if (0 < (int)pMVar48) {
                  local_138._0_4_ = 0;
                  do {
                    local_c0 = *(__m512 *)local_158;
                    uVar41 = (ulong)pafVar58 & 0xffffffff;
                    if (0 < (int)pafVar58) {
                      do {
                        uVar73 = *(undefined8 *)*pafVar65;
                        uVar80 = *(undefined8 *)(*pafVar65 + 2);
                        uVar81 = *(undefined8 *)(*pafVar65 + 4);
                        uVar82 = *(undefined8 *)(*pafVar65 + 6);
                        uVar83 = *(undefined8 *)(*pafVar65 + 8);
                        uVar84 = *(undefined8 *)(*pafVar65 + 10);
                        uVar85 = *(undefined8 *)(*pafVar65 + 0xc);
                        uVar86 = *(undefined8 *)(*pafVar65 + 0xe);
                        local_100 = *pafVar65;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                  (&local_159,&local_100,&local_c0);
                        *puVar60 = uVar73;
                        puVar60[1] = uVar80;
                        puVar60[2] = uVar81;
                        puVar60[3] = uVar82;
                        puVar60[4] = uVar83;
                        puVar60[5] = uVar84;
                        puVar60[6] = uVar85;
                        puVar60[7] = uVar86;
                        pafVar65 = pafVar65 + 1;
                        puVar60 = puVar60 + 8;
                        uVar62 = (int)uVar41 - 1;
                        uVar41 = (ulong)uVar62;
                      } while (uVar62 != 0);
                    }
                    local_158 = local_158 + 1;
                    local_138._0_4_ = (uint)local_138 + 1;
                    pafVar58 = local_140;
                    pMVar48 = local_150;
                  } while ((uint)local_138 != (int)local_150);
                }
                iVar39 = (int)local_128 + 1;
              } while (iVar39 != (int)local_148);
            }
            local_118 = local_118 + 1;
          } while (local_118 != local_120);
          return 0;
        }
        if (iVar39 == 2) {
          if (iVar43 < 1) {
            return 0;
          }
          local_118 = 0;
          do {
            if (0 < (int)local_148) {
              puVar60 = (undefined8 *)(c->cstep * local_118 * c->elemsize + (long)c->data);
              local_138 = (__m512 *)
                          ((long)local_130[1].w * local_118 * local_130[1].elemsize +
                          (long)local_130[1].data);
              pafVar65 = (__m512 *)
                         (local_130->cstep * local_118 * local_130->elemsize + (long)local_130->data
                         );
              iVar39 = 0;
              pafVar58 = local_140;
              pMVar48 = local_150;
              do {
                local_128 = CONCAT44(local_128._4_4_,iVar39);
                local_c0 = *local_138;
                if (0 < (int)pMVar48) {
                  iVar39 = 0;
                  do {
                    local_158 = (Option *)CONCAT44(local_158._4_4_,iVar39);
                    uVar41 = (ulong)pafVar58 & 0xffffffff;
                    if (0 < (int)pafVar58) {
                      do {
                        uVar73 = *(undefined8 *)*pafVar65;
                        uVar80 = *(undefined8 *)(*pafVar65 + 2);
                        uVar81 = *(undefined8 *)(*pafVar65 + 4);
                        uVar82 = *(undefined8 *)(*pafVar65 + 6);
                        uVar83 = *(undefined8 *)(*pafVar65 + 8);
                        uVar84 = *(undefined8 *)(*pafVar65 + 10);
                        uVar85 = *(undefined8 *)(*pafVar65 + 0xc);
                        uVar86 = *(undefined8 *)(*pafVar65 + 0xe);
                        local_100 = *pafVar65;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                  (&local_159,&local_100,&local_c0);
                        *puVar60 = uVar73;
                        puVar60[1] = uVar80;
                        puVar60[2] = uVar81;
                        puVar60[3] = uVar82;
                        puVar60[4] = uVar83;
                        puVar60[5] = uVar84;
                        puVar60[6] = uVar85;
                        puVar60[7] = uVar86;
                        pafVar65 = pafVar65 + 1;
                        puVar60 = puVar60 + 8;
                        uVar62 = (int)uVar41 - 1;
                        uVar41 = (ulong)uVar62;
                      } while (uVar62 != 0);
                    }
                    iVar39 = (uint)local_158 + 1;
                    pafVar58 = local_140;
                    pMVar48 = local_150;
                  } while (iVar39 != (int)local_150);
                }
                local_138 = local_138 + 1;
                iVar39 = (int)local_128 + 1;
              } while (iVar39 != (int)local_148);
            }
            local_118 = local_118 + 1;
          } while (local_118 != local_120);
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || local_130[1].w != 1) {
        if (iVar43 < 1) {
          return 0;
        }
        local_150 = (Mat *)0x0;
        do {
          local_c0 = *(__m512 *)((long)local_130[1].data + (long)local_150 * 0x40);
          if (0 < (int)local_128) {
            local_158 = (Option *)
                        ((long)local_130->data +
                        local_130->cstep * local_130->elemsize * (long)local_150);
            local_138 = (__m512 *)(c->cstep * c->elemsize * (long)local_150 + (long)c->data);
            lVar63 = 0;
            iVar39 = (int)local_128;
            do {
              pafVar58 = (__m512 *)((long)local_158 + lVar63);
              uVar73 = *(undefined8 *)*pafVar58;
              uVar80 = *(undefined8 *)(*pafVar58 + 2);
              uVar81 = *(undefined8 *)(*pafVar58 + 4);
              uVar82 = *(undefined8 *)(*pafVar58 + 6);
              uVar83 = *(undefined8 *)(*pafVar58 + 8);
              uVar84 = *(undefined8 *)(*pafVar58 + 10);
              uVar85 = *(undefined8 *)(*pafVar58 + 0xc);
              uVar86 = *(undefined8 *)(*pafVar58 + 0xe);
              local_100 = *pafVar58;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_159,&local_100,&local_c0);
              puVar60 = (undefined8 *)((long)local_138 + lVar63);
              *puVar60 = uVar73;
              puVar60[1] = uVar80;
              puVar60[2] = uVar81;
              puVar60[3] = uVar82;
              puVar60[4] = uVar83;
              puVar60[5] = uVar84;
              puVar60[6] = uVar85;
              puVar60[7] = uVar86;
              lVar63 = lVar63 + 0x40;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
          }
          local_150 = (Mat *)((long)local_150 + 1);
        } while (local_150 != (Mat *)local_120);
        return 0;
      }
    }
LAB_003c7d7f:
    pOVar46 = (Option *)opt->blob_allocator;
    goto LAB_003c7d84;
  case 7:
    pMVar50 = a;
    a = pMVar48;
    break;
  case 8:
    pMVar50 = a;
    a = pMVar48;
LAB_003bd913:
    iVar39 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>(a,pMVar50,c,opt);
    return iVar39;
  default:
    goto switchD_003bd1b5_default;
  }
  iVar39 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(a,pMVar50,c,opt);
  return iVar39;
switchD_003c17eb_caseD_1:
  local_130 = a;
  Mat::create(c,uVar62,local_108,iVar39,opt->blob_allocator);
  if (c->data == (void *)0x0) {
    return -100;
  }
  if ((long)c->c * c->cstep == 0) {
    return -100;
  }
  pOVar46 = (Option *)opt->blob_allocator;
  if (_elempack != 1 || local_130[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (local_130,pMVar48,c,pOVar46);
    return 0;
  }
  goto LAB_003c7d84;
switchD_003bd8a0_caseD_1:
  local_130 = a;
  Mat::create(c,uVar62,sVar7,iVar39,opt->blob_allocator);
  if (c->data == (void *)0x0) {
    return -100;
  }
  if ((long)c->c * c->cstep == 0) {
    return -100;
  }
  pOVar46 = (Option *)opt->blob_allocator;
  if (_elempack != 1 || local_130[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (local_130,pMVar48,c,pOVar46);
    return 0;
  }
LAB_003c7d84:
  iVar39 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                     (local_130,pMVar48,c,pOVar46);
  return iVar39;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_avx512_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}